

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_n<embree::sse2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined8 *puVar2;
  Primitive PVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  long lVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined6 uVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  RayK<4> *pRVar35;
  byte bVar36;
  int iVar37;
  long lVar39;
  RTCFilterFunctionN p_Var40;
  RTCRayN *pRVar41;
  bool bVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  LinearSpace3fa *pLVar48;
  bool bVar49;
  uint uVar50;
  uint uVar51;
  int iVar52;
  uint uVar53;
  uint uVar54;
  short sVar55;
  float fVar56;
  float fVar57;
  float fVar95;
  float fVar97;
  vfloat_impl<4> p00;
  undefined2 uVar94;
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  float fVar96;
  float fVar98;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar99;
  float fVar121;
  float fVar122;
  undefined1 auVar100 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float t1;
  float fVar123;
  float fVar134;
  float fVar135;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar136;
  float fVar140;
  float fVar141;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar142;
  float fVar155;
  float fVar156;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar157;
  float fVar174;
  float fVar175;
  vfloat4 a;
  undefined1 auVar158 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar176;
  float fVar181;
  float fVar182;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar183;
  float fVar205;
  float fVar206;
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar207;
  float fVar216;
  float fVar217;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar218;
  float fVar226;
  float fVar227;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar228;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar241;
  float fVar242;
  float fVar251;
  float fVar253;
  vfloat4 a_1;
  undefined1 auVar243 [16];
  float fVar255;
  undefined1 auVar246 [16];
  float fVar252;
  float fVar254;
  float fVar256;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar257;
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar264;
  float fVar265;
  float fVar269;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar270;
  float fVar271;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar282;
  float fVar285;
  float fVar286;
  undefined1 auVar283 [16];
  float fVar287;
  undefined1 auVar284 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint local_52c;
  undefined8 local_528;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 local_4a8;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_3d8 [16];
  undefined1 (*local_3c8) [16];
  RayK<4> *local_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  uint auStack_318 [4];
  RTCFilterFunctionNArguments local_308;
  uint local_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint local_2c8;
  uint uStack_2c4;
  uint uStack_2c0;
  uint uStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float afStack_58 [10];
  Primitive *pPVar38;
  undefined1 auVar90 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 uVar93;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  
  PVar3 = prim[1];
  uVar47 = (ulong)(byte)PVar3;
  pPVar38 = prim + uVar47 * 0x19 + 6;
  fVar135 = *(float *)(pPVar38 + 0xc);
  fVar136 = (*(float *)(ray + k * 4) - *(float *)pPVar38) * fVar135;
  fVar140 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar38 + 4)) * fVar135;
  fVar141 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar38 + 8)) * fVar135;
  fVar123 = *(float *)(ray + k * 4 + 0x40) * fVar135;
  fVar134 = *(float *)(ray + k * 4 + 0x50) * fVar135;
  fVar135 = *(float *)(ray + k * 4 + 0x60) * fVar135;
  uVar4 = *(undefined4 *)(prim + uVar47 * 4 + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar93),uVar93);
  sVar55 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar19,sVar55);
  auVar164._8_4_ = 0;
  auVar164._0_8_ = uVar46;
  auVar164._12_2_ = uVar94;
  auVar164._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._8_2_ = 0;
  auVar163._0_8_ = uVar46;
  auVar163._10_2_ = uVar94;
  auVar64._10_6_ = auVar163._10_6_;
  auVar64._8_2_ = uVar94;
  auVar64._0_8_ = uVar46;
  uVar94 = (undefined2)uVar19;
  auVar20._4_8_ = auVar64._8_8_;
  auVar20._2_2_ = uVar94;
  auVar20._0_2_ = uVar94;
  fVar99 = (float)((int)sVar55 >> 8);
  fVar121 = (float)(auVar20._0_4_ >> 0x18);
  fVar122 = (float)(auVar64._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar47 * 5 + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar93),uVar93);
  sVar55 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar19,sVar55);
  auVar273._8_4_ = 0;
  auVar273._0_8_ = uVar46;
  auVar273._12_2_ = uVar94;
  auVar273._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar220._12_4_ = auVar273._12_4_;
  auVar220._8_2_ = 0;
  auVar220._0_8_ = uVar46;
  auVar220._10_2_ = uVar94;
  auVar127._10_6_ = auVar220._10_6_;
  auVar127._8_2_ = uVar94;
  auVar127._0_8_ = uVar46;
  uVar94 = (undefined2)uVar19;
  auVar21._4_8_ = auVar127._8_8_;
  auVar21._2_2_ = uVar94;
  auVar21._0_2_ = uVar94;
  fVar142 = (float)((int)sVar55 >> 8);
  fVar155 = (float)(auVar21._0_4_ >> 0x18);
  fVar156 = (float)(auVar127._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar47 * 6 + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar93),uVar93);
  sVar55 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar19,sVar55);
  auVar60._8_4_ = 0;
  auVar60._0_8_ = uVar46;
  auVar60._12_2_ = uVar94;
  auVar60._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._8_2_ = 0;
  auVar59._0_8_ = uVar46;
  auVar59._10_2_ = uVar94;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._8_2_ = uVar94;
  auVar58._0_8_ = uVar46;
  uVar94 = (undefined2)uVar19;
  auVar22._4_8_ = auVar58._8_8_;
  auVar22._2_2_ = uVar94;
  auVar22._0_2_ = uVar94;
  fVar176 = (float)((int)sVar55 >> 8);
  fVar181 = (float)(auVar22._0_4_ >> 0x18);
  fVar182 = (float)(auVar58._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar47 * 0xb + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar93),uVar93);
  sVar55 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar19,sVar55);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar46;
  auVar63._12_2_ = uVar94;
  auVar63._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar46;
  auVar62._10_2_ = uVar94;
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = uVar94;
  auVar61._0_8_ = uVar46;
  uVar94 = (undefined2)uVar19;
  auVar23._4_8_ = auVar61._8_8_;
  auVar23._2_2_ = uVar94;
  auVar23._0_2_ = uVar94;
  fVar56 = (float)((int)sVar55 >> 8);
  fVar95 = (float)(auVar23._0_4_ >> 0x18);
  fVar97 = (float)(auVar61._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar93),uVar93);
  sVar55 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar19,sVar55);
  auVar160._8_4_ = 0;
  auVar160._0_8_ = uVar46;
  auVar160._12_2_ = uVar94;
  auVar160._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar159._12_4_ = auVar160._12_4_;
  auVar159._8_2_ = 0;
  auVar159._0_8_ = uVar46;
  auVar159._10_2_ = uVar94;
  auVar158._10_6_ = auVar159._10_6_;
  auVar158._8_2_ = uVar94;
  auVar158._0_8_ = uVar46;
  uVar94 = (undefined2)uVar19;
  auVar24._4_8_ = auVar158._8_8_;
  auVar24._2_2_ = uVar94;
  auVar24._0_2_ = uVar94;
  fVar157 = (float)((int)sVar55 >> 8);
  fVar174 = (float)(auVar24._0_4_ >> 0x18);
  fVar175 = (float)(auVar158._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + (uint)(byte)PVar3 * 0xc + uVar47 + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar93),uVar93);
  sVar55 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar19,sVar55);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar46;
  auVar186._12_2_ = uVar94;
  auVar186._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar46;
  auVar185._10_2_ = uVar94;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar94;
  auVar184._0_8_ = uVar46;
  uVar94 = (undefined2)uVar19;
  auVar25._4_8_ = auVar184._8_8_;
  auVar25._2_2_ = uVar94;
  auVar25._0_2_ = uVar94;
  fVar218 = (float)((int)sVar55 >> 8);
  fVar226 = (float)(auVar25._0_4_ >> 0x18);
  fVar227 = (float)(auVar184._8_4_ >> 0x18);
  uVar45 = (ulong)(uint)((int)(uVar47 * 9) * 2);
  uVar4 = *(undefined4 *)(prim + uVar45 + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar93),uVar93);
  sVar55 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar19,sVar55);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar46;
  auVar189._12_2_ = uVar94;
  auVar189._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar46;
  auVar188._10_2_ = uVar94;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar94;
  auVar187._0_8_ = uVar46;
  uVar94 = (undefined2)uVar19;
  auVar26._4_8_ = auVar187._8_8_;
  auVar26._2_2_ = uVar94;
  auVar26._0_2_ = uVar94;
  fVar207 = (float)((int)sVar55 >> 8);
  fVar216 = (float)(auVar26._0_4_ >> 0x18);
  fVar217 = (float)(auVar187._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar45 + uVar47 + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar93),uVar93);
  sVar55 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar19,sVar55);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar46;
  auVar192._12_2_ = uVar94;
  auVar192._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar46;
  auVar191._10_2_ = uVar94;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar94;
  auVar190._0_8_ = uVar46;
  uVar94 = (undefined2)uVar19;
  auVar27._4_8_ = auVar190._8_8_;
  auVar27._2_2_ = uVar94;
  auVar27._0_2_ = uVar94;
  fVar228 = (float)((int)sVar55 >> 8);
  fVar234 = (float)(auVar27._0_4_ >> 0x18);
  fVar236 = (float)(auVar190._8_4_ >> 0x18);
  uVar43 = (ulong)(uint)((int)(uVar47 * 5) << 2);
  uVar4 = *(undefined4 *)(prim + uVar43 + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar19 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar93),uVar93);
  sVar55 = CONCAT11((char)uVar4,(char)uVar4);
  uVar46 = CONCAT62(uVar19,sVar55);
  auVar245._8_4_ = 0;
  auVar245._0_8_ = uVar46;
  auVar245._12_2_ = uVar94;
  auVar245._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar244._12_4_ = auVar245._12_4_;
  auVar244._8_2_ = 0;
  auVar244._0_8_ = uVar46;
  auVar244._10_2_ = uVar94;
  auVar243._10_6_ = auVar244._10_6_;
  auVar243._8_2_ = uVar94;
  auVar243._0_8_ = uVar46;
  uVar94 = (undefined2)uVar19;
  auVar28._4_8_ = auVar243._8_8_;
  auVar28._2_2_ = uVar94;
  auVar28._0_2_ = uVar94;
  fVar57 = (float)((int)sVar55 >> 8);
  fVar96 = (float)(auVar28._0_4_ >> 0x18);
  fVar98 = (float)(auVar243._8_4_ >> 0x18);
  fVar257 = fVar123 * fVar99 + fVar134 * fVar142 + fVar135 * fVar176;
  fVar261 = fVar123 * fVar121 + fVar134 * fVar155 + fVar135 * fVar181;
  fVar262 = fVar123 * fVar122 + fVar134 * fVar156 + fVar135 * fVar182;
  fVar263 = fVar123 * (float)(auVar163._12_4_ >> 0x18) +
            fVar134 * (float)(auVar220._12_4_ >> 0x18) + fVar135 * (float)(auVar59._12_4_ >> 0x18);
  fVar241 = fVar123 * fVar56 + fVar134 * fVar157 + fVar135 * fVar218;
  fVar251 = fVar123 * fVar95 + fVar134 * fVar174 + fVar135 * fVar226;
  fVar253 = fVar123 * fVar97 + fVar134 * fVar175 + fVar135 * fVar227;
  fVar255 = fVar123 * (float)(auVar62._12_4_ >> 0x18) +
            fVar134 * (float)(auVar159._12_4_ >> 0x18) + fVar135 * (float)(auVar185._12_4_ >> 0x18);
  fVar183 = fVar123 * fVar207 + fVar134 * fVar228 + fVar135 * fVar57;
  fVar205 = fVar123 * fVar216 + fVar134 * fVar234 + fVar135 * fVar96;
  fVar206 = fVar123 * fVar217 + fVar134 * fVar236 + fVar135 * fVar98;
  fVar123 = fVar123 * (float)(auVar188._12_4_ >> 0x18) +
            fVar134 * (float)(auVar191._12_4_ >> 0x18) + fVar135 * (float)(auVar244._12_4_ >> 0x18);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar142 = fVar99 * fVar136 + fVar142 * fVar140 + fVar176 * fVar141;
  fVar155 = fVar121 * fVar136 + fVar155 * fVar140 + fVar181 * fVar141;
  fVar156 = fVar122 * fVar136 + fVar156 * fVar140 + fVar182 * fVar141;
  fVar176 = (float)(auVar163._12_4_ >> 0x18) * fVar136 +
            (float)(auVar220._12_4_ >> 0x18) * fVar140 + (float)(auVar59._12_4_ >> 0x18) * fVar141;
  fVar181 = fVar56 * fVar136 + fVar157 * fVar140 + fVar218 * fVar141;
  fVar182 = fVar95 * fVar136 + fVar174 * fVar140 + fVar226 * fVar141;
  fVar218 = fVar97 * fVar136 + fVar175 * fVar140 + fVar227 * fVar141;
  fVar226 = (float)(auVar62._12_4_ >> 0x18) * fVar136 +
            (float)(auVar159._12_4_ >> 0x18) * fVar140 + (float)(auVar185._12_4_ >> 0x18) * fVar141;
  fVar157 = fVar136 * fVar207 + fVar140 * fVar228 + fVar141 * fVar57;
  fVar174 = fVar136 * fVar216 + fVar140 * fVar234 + fVar141 * fVar96;
  fVar175 = fVar136 * fVar217 + fVar140 * fVar236 + fVar141 * fVar98;
  fVar136 = fVar136 * (float)(auVar188._12_4_ >> 0x18) +
            fVar140 * (float)(auVar191._12_4_ >> 0x18) + fVar141 * (float)(auVar244._12_4_ >> 0x18);
  fVar135 = (float)DAT_01f80d30;
  fVar56 = DAT_01f80d30._4_4_;
  fVar57 = DAT_01f80d30._8_4_;
  fVar95 = DAT_01f80d30._12_4_;
  uVar50 = -(uint)(fVar135 <= ABS(fVar257));
  uVar51 = -(uint)(fVar56 <= ABS(fVar261));
  uVar53 = -(uint)(fVar57 <= ABS(fVar262));
  uVar54 = -(uint)(fVar95 <= ABS(fVar263));
  auVar258._0_4_ = (uint)fVar257 & uVar50;
  auVar258._4_4_ = (uint)fVar261 & uVar51;
  auVar258._8_4_ = (uint)fVar262 & uVar53;
  auVar258._12_4_ = (uint)fVar263 & uVar54;
  auVar143._0_4_ = ~uVar50 & (uint)fVar135;
  auVar143._4_4_ = ~uVar51 & (uint)fVar56;
  auVar143._8_4_ = ~uVar53 & (uint)fVar57;
  auVar143._12_4_ = ~uVar54 & (uint)fVar95;
  auVar143 = auVar143 | auVar258;
  uVar50 = -(uint)(fVar135 <= ABS(fVar241));
  uVar51 = -(uint)(fVar56 <= ABS(fVar251));
  uVar53 = -(uint)(fVar57 <= ABS(fVar253));
  uVar54 = -(uint)(fVar95 <= ABS(fVar255));
  auVar246._0_4_ = (uint)fVar241 & uVar50;
  auVar246._4_4_ = (uint)fVar251 & uVar51;
  auVar246._8_4_ = (uint)fVar253 & uVar53;
  auVar246._12_4_ = (uint)fVar255 & uVar54;
  auVar161._0_4_ = ~uVar50 & (uint)fVar135;
  auVar161._4_4_ = ~uVar51 & (uint)fVar56;
  auVar161._8_4_ = ~uVar53 & (uint)fVar57;
  auVar161._12_4_ = ~uVar54 & (uint)fVar95;
  auVar161 = auVar161 | auVar246;
  uVar50 = -(uint)(fVar135 <= ABS(fVar183));
  uVar51 = -(uint)(fVar56 <= ABS(fVar205));
  uVar53 = -(uint)(fVar57 <= ABS(fVar206));
  uVar54 = -(uint)(fVar95 <= ABS(fVar123));
  auVar193._0_4_ = (uint)fVar183 & uVar50;
  auVar193._4_4_ = (uint)fVar205 & uVar51;
  auVar193._8_4_ = (uint)fVar206 & uVar53;
  auVar193._12_4_ = (uint)fVar123 & uVar54;
  auVar177._0_4_ = ~uVar50 & (uint)fVar135;
  auVar177._4_4_ = ~uVar51 & (uint)fVar56;
  auVar177._8_4_ = ~uVar53 & (uint)fVar57;
  auVar177._12_4_ = ~uVar54 & (uint)fVar95;
  auVar177 = auVar177 | auVar193;
  auVar64 = rcpps(_DAT_01f80d30,auVar143);
  fVar135 = auVar64._0_4_;
  fVar95 = auVar64._4_4_;
  fVar98 = auVar64._8_4_;
  fVar122 = auVar64._12_4_;
  fVar135 = (1.0 - auVar143._0_4_ * fVar135) * fVar135 + fVar135;
  fVar95 = (1.0 - auVar143._4_4_ * fVar95) * fVar95 + fVar95;
  fVar98 = (1.0 - auVar143._8_4_ * fVar98) * fVar98 + fVar98;
  fVar122 = (1.0 - auVar143._12_4_ * fVar122) * fVar122 + fVar122;
  auVar64 = rcpps(auVar64,auVar161);
  fVar56 = auVar64._0_4_;
  fVar96 = auVar64._4_4_;
  fVar99 = auVar64._8_4_;
  fVar123 = auVar64._12_4_;
  fVar56 = (1.0 - auVar161._0_4_ * fVar56) * fVar56 + fVar56;
  fVar96 = (1.0 - auVar161._4_4_ * fVar96) * fVar96 + fVar96;
  fVar99 = (1.0 - auVar161._8_4_ * fVar99) * fVar99 + fVar99;
  fVar123 = (1.0 - auVar161._12_4_ * fVar123) * fVar123 + fVar123;
  auVar64 = rcpps(auVar64,auVar177);
  fVar57 = auVar64._0_4_;
  fVar97 = auVar64._4_4_;
  fVar121 = auVar64._8_4_;
  fVar134 = auVar64._12_4_;
  fVar57 = (1.0 - auVar177._0_4_ * fVar57) * fVar57 + fVar57;
  fVar97 = (1.0 - auVar177._4_4_ * fVar97) * fVar97 + fVar97;
  fVar121 = (1.0 - auVar177._8_4_ * fVar121) * fVar121 + fVar121;
  fVar134 = (1.0 - auVar177._12_4_ * fVar134) * fVar134 + fVar134;
  uVar46 = *(ulong *)(prim + uVar47 * 7 + 6);
  uVar94 = (undefined2)(uVar46 >> 0x30);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar46;
  auVar67._12_2_ = uVar94;
  auVar67._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar46 >> 0x20);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar46;
  auVar66._10_2_ = uVar94;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = uVar94;
  auVar65._0_8_ = uVar46;
  uVar94 = (undefined2)(uVar46 >> 0x10);
  auVar29._4_8_ = auVar65._8_8_;
  auVar29._2_2_ = uVar94;
  auVar29._0_2_ = uVar94;
  auVar144._0_8_ =
       CONCAT44(((float)(auVar29._0_4_ >> 0x10) - fVar155) * fVar95,
                ((float)(int)(short)uVar46 - fVar142) * fVar135);
  auVar144._8_4_ = ((float)(auVar65._8_4_ >> 0x10) - fVar156) * fVar98;
  auVar144._12_4_ = ((float)(auVar66._12_4_ >> 0x10) - fVar176) * fVar122;
  uVar46 = *(ulong *)(prim + uVar47 * 9 + 6);
  uVar94 = (undefined2)(uVar46 >> 0x30);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar46;
  auVar70._12_2_ = uVar94;
  auVar70._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar46 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar46;
  auVar69._10_2_ = uVar94;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar94;
  auVar68._0_8_ = uVar46;
  uVar94 = (undefined2)(uVar46 >> 0x10);
  auVar30._4_8_ = auVar68._8_8_;
  auVar30._2_2_ = uVar94;
  auVar30._0_2_ = uVar94;
  auVar178._0_4_ = ((float)(int)(short)uVar46 - fVar142) * fVar135;
  auVar178._4_4_ = ((float)(auVar30._0_4_ >> 0x10) - fVar155) * fVar95;
  auVar178._8_4_ = ((float)(auVar68._8_4_ >> 0x10) - fVar156) * fVar98;
  auVar178._12_4_ = ((float)(auVar69._12_4_ >> 0x10) - fVar176) * fVar122;
  uVar46 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  uVar45 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar47 * -2 + 6);
  uVar94 = (undefined2)(uVar45 >> 0x30);
  auVar102._8_4_ = 0;
  auVar102._0_8_ = uVar45;
  auVar102._12_2_ = uVar94;
  auVar102._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar45 >> 0x20);
  auVar101._12_4_ = auVar102._12_4_;
  auVar101._8_2_ = 0;
  auVar101._0_8_ = uVar45;
  auVar101._10_2_ = uVar94;
  auVar100._10_6_ = auVar101._10_6_;
  auVar100._8_2_ = uVar94;
  auVar100._0_8_ = uVar45;
  uVar94 = (undefined2)(uVar45 >> 0x10);
  auVar31._4_8_ = auVar100._8_8_;
  auVar31._2_2_ = uVar94;
  auVar31._0_2_ = uVar94;
  auVar103._0_8_ =
       CONCAT44(((float)(auVar31._0_4_ >> 0x10) - fVar182) * fVar96,
                ((float)(int)(short)uVar45 - fVar181) * fVar56);
  auVar103._8_4_ = ((float)(auVar100._8_4_ >> 0x10) - fVar218) * fVar99;
  auVar103._12_4_ = ((float)(auVar101._12_4_ >> 0x10) - fVar226) * fVar123;
  uVar94 = (undefined2)(uVar46 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar46;
  auVar73._12_2_ = uVar94;
  auVar73._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar46 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar46;
  auVar72._10_2_ = uVar94;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar94;
  auVar71._0_8_ = uVar46;
  uVar94 = (undefined2)(uVar46 >> 0x10);
  auVar32._4_8_ = auVar71._8_8_;
  auVar32._2_2_ = uVar94;
  auVar32._0_2_ = uVar94;
  auVar208._0_4_ = ((float)(int)(short)uVar46 - fVar181) * fVar56;
  auVar208._4_4_ = ((float)(auVar32._0_4_ >> 0x10) - fVar182) * fVar96;
  auVar208._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar218) * fVar99;
  auVar208._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar226) * fVar123;
  uVar46 = *(ulong *)(prim + uVar43 + uVar47 + 6);
  uVar94 = (undefined2)(uVar46 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar46;
  auVar76._12_2_ = uVar94;
  auVar76._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar46 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar46;
  auVar75._10_2_ = uVar94;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar94;
  auVar74._0_8_ = uVar46;
  uVar94 = (undefined2)(uVar46 >> 0x10);
  auVar33._4_8_ = auVar74._8_8_;
  auVar33._2_2_ = uVar94;
  auVar33._0_2_ = uVar94;
  auVar77._0_8_ =
       CONCAT44(((float)(auVar33._0_4_ >> 0x10) - fVar174) * fVar97,
                ((float)(int)(short)uVar46 - fVar157) * fVar57);
  auVar77._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar175) * fVar121;
  auVar77._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar136) * fVar134;
  uVar46 = *(ulong *)(prim + uVar47 * 0x17 + 6);
  uVar94 = (undefined2)(uVar46 >> 0x30);
  auVar196._8_4_ = 0;
  auVar196._0_8_ = uVar46;
  auVar196._12_2_ = uVar94;
  auVar196._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar46 >> 0x20);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._8_2_ = 0;
  auVar195._0_8_ = uVar46;
  auVar195._10_2_ = uVar94;
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = uVar94;
  auVar194._0_8_ = uVar46;
  uVar94 = (undefined2)(uVar46 >> 0x10);
  auVar34._4_8_ = auVar194._8_8_;
  auVar34._2_2_ = uVar94;
  auVar34._0_2_ = uVar94;
  auVar197._0_4_ = ((float)(int)(short)uVar46 - fVar157) * fVar57;
  auVar197._4_4_ = ((float)(auVar34._0_4_ >> 0x10) - fVar174) * fVar97;
  auVar197._8_4_ = ((float)(auVar194._8_4_ >> 0x10) - fVar175) * fVar121;
  auVar197._12_4_ = ((float)(auVar195._12_4_ >> 0x10) - fVar136) * fVar134;
  auVar162._8_4_ = auVar144._8_4_;
  auVar162._0_8_ = auVar144._0_8_;
  auVar162._12_4_ = auVar144._12_4_;
  auVar163 = minps(auVar162,auVar178);
  auVar124._8_4_ = auVar103._8_4_;
  auVar124._0_8_ = auVar103._0_8_;
  auVar124._12_4_ = auVar103._12_4_;
  auVar64 = minps(auVar124,auVar208);
  auVar163 = maxps(auVar163,auVar64);
  auVar125._8_4_ = auVar77._8_4_;
  auVar125._0_8_ = auVar77._0_8_;
  auVar125._12_4_ = auVar77._12_4_;
  auVar64 = minps(auVar125,auVar197);
  auVar137._4_4_ = uVar4;
  auVar137._0_4_ = uVar4;
  auVar137._8_4_ = uVar4;
  auVar137._12_4_ = uVar4;
  auVar64 = maxps(auVar64,auVar137);
  auVar164 = maxps(auVar163,auVar64);
  auVar163 = maxps(auVar144,auVar178);
  auVar64 = maxps(auVar103,auVar208);
  auVar163 = minps(auVar163,auVar64);
  local_278 = auVar164._0_4_ * 0.99999964;
  fStack_274 = auVar164._4_4_ * 0.99999964;
  fStack_270 = auVar164._8_4_ * 0.99999964;
  fStack_26c = auVar164._12_4_ * 0.99999964;
  auVar64 = maxps(auVar77,auVar197);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar104._4_4_ = uVar4;
  auVar104._0_4_ = uVar4;
  auVar104._8_4_ = uVar4;
  auVar104._12_4_ = uVar4;
  auVar64 = minps(auVar64,auVar104);
  auVar64 = minps(auVar163,auVar64);
  auVar105._0_4_ = -(uint)(PVar3 != (Primitive)0x0 && local_278 <= auVar64._0_4_ * 1.0000004);
  auVar105._4_4_ = -(uint)(1 < (byte)PVar3 && fStack_274 <= auVar64._4_4_ * 1.0000004);
  auVar105._8_4_ = -(uint)(2 < (byte)PVar3 && fStack_270 <= auVar64._8_4_ * 1.0000004);
  auVar105._12_4_ = -(uint)(3 < (byte)PVar3 && fStack_26c <= auVar64._12_4_ * 1.0000004);
  uVar50 = movmskps((uint)(byte)PVar3,auVar105);
  if (uVar50 == 0) {
    return false;
  }
  uVar50 = uVar50 & 0xff;
  local_4a8 = pre->ray_space + k;
  local_3c8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_258._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_258._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_258._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_258._12_4_ = 0;
  local_3c0 = ray;
LAB_00a93ced:
  pRVar35 = local_3c0;
  pLVar48 = local_4a8;
  uVar46 = (ulong)uVar50;
  lVar39 = 0;
  if (uVar46 != 0) {
    for (; (uVar50 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
    }
  }
  uVar50 = *(uint *)(prim + 2);
  local_2d8 = *(uint *)(prim + lVar39 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar50].ptr;
  uVar45 = *(ulong *)&pGVar5->field_0x58;
  _Var6 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar47 = (ulong)*(uint *)(uVar45 + _Var6 * local_2d8);
  p_Var40 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var8 + uVar47 * (long)pvVar7);
  fVar135 = *pfVar1;
  fVar56 = pfVar1[1];
  fVar57 = pfVar1[2];
  fVar95 = pfVar1[3];
  puVar2 = (undefined8 *)(_Var8 + (uVar47 + 1) * (long)pvVar7);
  uVar17 = *puVar2;
  uVar18 = puVar2[1];
  pfVar1 = (float *)(_Var8 + (uVar47 + 2) * (long)pvVar7);
  fVar96 = *pfVar1;
  fVar97 = pfVar1[1];
  fVar98 = pfVar1[2];
  fVar99 = pfVar1[3];
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar47 + 3));
  fVar121 = *pfVar1;
  fVar122 = pfVar1[1];
  fVar123 = pfVar1[2];
  fVar134 = pfVar1[3];
  uVar46 = uVar46 - 1 & uVar46;
  lVar39 = *(long *)&pGVar5[1].time_range.upper;
  pfVar1 = (float *)(lVar39 + (long)p_Var40 * uVar47);
  fVar142 = *pfVar1;
  fVar155 = pfVar1[1];
  fVar156 = pfVar1[2];
  fVar176 = pfVar1[3];
  pfVar1 = (float *)(lVar39 + (long)p_Var40 * (uVar47 + 1));
  fVar157 = *pfVar1;
  fVar174 = pfVar1[1];
  fVar175 = pfVar1[2];
  fVar136 = pfVar1[3];
  pfVar1 = (float *)(lVar39 + (long)p_Var40 * (uVar47 + 2));
  fVar140 = *pfVar1;
  fVar141 = pfVar1[1];
  fVar181 = pfVar1[2];
  fVar182 = pfVar1[3];
  lVar9 = 0;
  if (uVar46 != 0) {
    for (; (uVar46 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  pfVar1 = (float *)(lVar39 + (long)p_Var40 * (uVar47 + 3));
  fVar183 = *pfVar1;
  fVar205 = pfVar1[1];
  fVar206 = pfVar1[2];
  fVar207 = pfVar1[3];
  if ((uVar46 != 0) && (uVar47 = uVar46 - 1 & uVar46, uVar47 != 0)) {
    lVar39 = 0;
    if (uVar47 != 0) {
      for (; (uVar47 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
      }
    }
    uVar45 = (ulong)*(uint *)(uVar45 + _Var6 * *(uint *)(prim + lVar39 * 4 + 6));
  }
  local_1b8 = *(float *)(local_3c0 + k * 4);
  fStack_1b4 = *(float *)(local_3c0 + k * 4 + 0x10);
  fStack_1b0 = *(float *)(local_3c0 + k * 4 + 0x20);
  fVar227 = (fVar140 * 0.5 + fVar183 * 0.0 + fVar157 * 0.0) - fVar142 * 0.5;
  fVar228 = (fVar141 * 0.5 + fVar205 * 0.0 + fVar174 * 0.0) - fVar155 * 0.5;
  fVar234 = (fVar181 * 0.5 + fVar206 * 0.0 + fVar175 * 0.0) - fVar156 * 0.5;
  fVar236 = (fVar182 * 0.5 + fVar207 * 0.0 + fVar136 * 0.0) - fVar176 * 0.5;
  local_4b8 = (float)uVar17;
  fStack_4b4 = (float)((ulong)uVar17 >> 0x20);
  fStack_4b0 = (float)uVar18;
  fStack_4ac = (float)((ulong)uVar18 >> 0x20);
  fVar257 = (fVar96 * 0.5 + fVar121 * 0.0 + local_4b8 * 0.0) - fVar135 * 0.5;
  fVar261 = (fVar97 * 0.5 + fVar122 * 0.0 + fStack_4b4 * 0.0) - fVar56 * 0.5;
  fVar262 = (fVar98 * 0.5 + fVar123 * 0.0 + fStack_4b0 * 0.0) - fVar57 * 0.5;
  fVar263 = (fVar99 * 0.5 + fVar134 * 0.0 + fStack_4ac * 0.0) - fVar95 * 0.5;
  fVar216 = fVar140 * 0.0 + fVar183 * -0.0 + fVar157 + fVar142 * -0.0;
  fVar217 = fVar141 * 0.0 + fVar205 * -0.0 + fVar174 + fVar155 * -0.0;
  fVar218 = fVar181 * 0.0 + fVar206 * -0.0 + fVar175 + fVar156 * -0.0;
  fVar226 = fVar182 * 0.0 + fVar207 * -0.0 + fVar136 + fVar176 * -0.0;
  fVar241 = fVar183 * -0.0 + fVar140 + fVar157 * 0.0 + fVar142 * -0.0;
  fVar251 = fVar205 * -0.0 + fVar141 + fVar174 * 0.0 + fVar155 * -0.0;
  fVar253 = fVar206 * -0.0 + fVar181 + fVar175 * 0.0 + fVar156 * -0.0;
  fVar255 = fVar207 * -0.0 + fVar182 + fVar136 * 0.0 + fVar176 * -0.0;
  fVar270 = fVar96 * 0.0 + fVar121 * -0.0 + local_4b8 + fVar135 * -0.0;
  fVar276 = fVar97 * 0.0 + fVar122 * -0.0 + fStack_4b4 + fVar56 * -0.0;
  fVar278 = fVar98 * 0.0 + fVar123 * -0.0 + fStack_4b0 + fVar57 * -0.0;
  fVar280 = fVar99 * 0.0 + fVar134 * -0.0 + fStack_4ac + fVar95 * -0.0;
  fVar142 = fVar142 * 0.0 + ((fVar183 * 0.5 + fVar140 * 0.0) - fVar157 * 0.5);
  fVar155 = fVar155 * 0.0 + ((fVar205 * 0.5 + fVar141 * 0.0) - fVar174 * 0.5);
  fVar156 = fVar156 * 0.0 + ((fVar206 * 0.5 + fVar181 * 0.0) - fVar175 * 0.5);
  fVar176 = fVar176 * 0.0 + ((fVar207 * 0.5 + fVar182 * 0.0) - fVar136 * 0.5);
  fVar157 = fVar121 * -0.0 + fVar96 + local_4b8 * 0.0 + fVar135 * -0.0;
  fVar174 = fVar122 * -0.0 + fVar97 + fStack_4b4 * 0.0 + fVar56 * -0.0;
  fVar175 = fVar123 * -0.0 + fVar98 + fStack_4b0 * 0.0 + fVar57 * -0.0;
  fVar136 = fVar134 * -0.0 + fVar99 + fStack_4ac * 0.0 + fVar95 * -0.0;
  fVar135 = fVar135 * 0.0 + ((fVar121 * 0.5 + fVar96 * 0.0) - local_4b8 * 0.5);
  fVar56 = fVar56 * 0.0 + ((fVar122 * 0.5 + fVar97 * 0.0) - fStack_4b4 * 0.5);
  fVar96 = fVar57 * 0.0 + ((fVar123 * 0.5 + fVar98 * 0.0) - fStack_4b0 * 0.5);
  fVar140 = fVar95 * 0.0 + ((fVar134 * 0.5 + fVar99 * 0.0) - fStack_4ac * 0.5);
  fVar183 = fVar228 * fVar270 - fVar276 * fVar227;
  fVar181 = fVar234 * fVar276 - fVar278 * fVar228;
  fVar182 = fVar227 * fVar278 - fVar270 * fVar234;
  fVar207 = fVar236 * fVar280 - fVar280 * fVar236;
  fVar98 = fVar228 * fVar257 - fVar261 * fVar227;
  fVar123 = fVar234 * fVar261 - fVar262 * fVar228;
  fVar134 = fVar227 * fVar262 - fVar257 * fVar234;
  fVar99 = fVar155 * fVar157 - fVar174 * fVar142;
  fVar174 = fVar156 * fVar174 - fVar175 * fVar155;
  fVar157 = fVar142 * fVar175 - fVar157 * fVar156;
  fVar175 = fVar176 * fVar136 - fVar136 * fVar176;
  fVar57 = fVar155 * fVar135 - fVar56 * fVar142;
  fVar56 = fVar156 * fVar56 - fVar96 * fVar155;
  fVar96 = fVar142 * fVar96 - fVar135 * fVar156;
  fVar141 = fVar182 * fVar182 + fVar181 * fVar181 + fVar183 * fVar183;
  auVar163 = ZEXT416((uint)fVar141);
  auVar64 = rsqrtss(ZEXT416((uint)fVar141),auVar163);
  fVar135 = auVar64._0_4_;
  fVar205 = fVar135 * 1.5 - fVar135 * fVar135 * fVar141 * 0.5 * fVar135;
  fVar257 = fVar183 * fVar98 + fVar182 * fVar134 + fVar181 * fVar123;
  fVar135 = fVar207 * fVar205;
  auVar64 = rcpss(auVar163,auVar163);
  fVar121 = (2.0 - fVar141 * auVar64._0_4_) * auVar64._0_4_;
  fVar136 = fVar157 * fVar157 + fVar174 * fVar174 + fVar99 * fVar99;
  auVar64 = ZEXT416((uint)fVar136);
  auVar163 = rsqrtss(ZEXT416((uint)fVar136),auVar64);
  fVar95 = auVar163._0_4_;
  fVar122 = fVar95 * 1.5 - fVar95 * fVar95 * fVar136 * 0.5 * fVar95;
  fVar206 = fVar99 * fVar57 + fVar157 * fVar96 + fVar174 * fVar56;
  fVar97 = fVar175 * fVar122;
  auVar64 = rcpss(auVar64,auVar64);
  fVar95 = (2.0 - fVar136 * auVar64._0_4_) * auVar64._0_4_;
  local_378 = fVar226 * fVar181 * fVar205;
  fStack_374 = fVar226 * fVar182 * fVar205;
  fStack_370 = fVar226 * fVar183 * fVar205;
  fStack_36c = fVar226 * fVar135;
  local_388 = fVar216 - local_378;
  fStack_384 = fVar217 - fStack_374;
  fStack_380 = fVar218 - fStack_370;
  fStack_37c = fVar226 - fStack_36c;
  fVar181 = fVar226 * fVar121 * (fVar141 * fVar123 - fVar257 * fVar181) * fVar205 +
            fVar236 * fVar181 * fVar205;
  fVar182 = fVar226 * fVar121 * (fVar141 * fVar134 - fVar257 * fVar182) * fVar205 +
            fVar236 * fVar182 * fVar205;
  fVar183 = fVar226 * fVar121 * (fVar141 * fVar98 - fVar257 * fVar183) * fVar205 +
            fVar236 * fVar183 * fVar205;
  fVar205 = fVar226 * fVar121 * (fVar141 * (fVar236 * fVar263 - fVar263 * fVar236) -
                                fVar257 * fVar207) * fVar205 + fVar236 * fVar135;
  local_378 = local_378 + fVar216;
  fStack_374 = fStack_374 + fVar217;
  fStack_370 = fStack_370 + fVar218;
  fStack_36c = fStack_36c + fVar226;
  fVar98 = fVar255 * fVar174 * fVar122;
  fVar121 = fVar255 * fVar157 * fVar122;
  fVar123 = fVar255 * fVar99 * fVar122;
  fVar134 = fVar255 * fVar97;
  local_3a8 = fVar241 - fVar98;
  fStack_3a4 = fVar251 - fVar121;
  fStack_3a0 = fVar253 - fVar123;
  fStack_39c = fVar255 - fVar134;
  fVar135 = fVar255 * fVar95 * (fVar136 * fVar56 - fVar206 * fVar174) * fVar122 +
            fVar176 * fVar174 * fVar122;
  fVar56 = fVar255 * fVar95 * (fVar136 * fVar96 - fVar206 * fVar157) * fVar122 +
           fVar176 * fVar157 * fVar122;
  fVar57 = fVar255 * fVar95 * (fVar136 * fVar57 - fVar206 * fVar99) * fVar122 +
           fVar176 * fVar99 * fVar122;
  fVar95 = fVar255 * fVar95 * (fVar136 * (fVar176 * fVar140 - fVar140 * fVar176) - fVar206 * fVar175
                              ) * fVar122 + fVar176 * fVar97;
  fVar98 = fVar98 + fVar241;
  fVar121 = fVar121 + fVar251;
  fVar123 = fVar123 + fVar253;
  fVar134 = fVar134 + fVar255;
  local_398 = (fVar227 - fVar181) * 0.33333334 + local_388;
  fStack_394 = (fVar228 - fVar182) * 0.33333334 + fStack_384;
  fStack_390 = (fVar234 - fVar183) * 0.33333334 + fStack_380;
  fStack_38c = (fVar236 - fVar205) * 0.33333334 + fStack_37c;
  local_3b8 = local_3a8 - (fVar142 - fVar135) * 0.33333334;
  fStack_3b4 = fStack_3a4 - (fVar155 - fVar56) * 0.33333334;
  fStack_3b0 = fStack_3a0 - (fVar156 - fVar57) * 0.33333334;
  fStack_3ac = fStack_39c - (fVar176 - fVar95) * 0.33333334;
  fVar157 = fVar98 - (fVar135 + fVar142) * 0.33333334;
  fVar174 = fVar121 - (fVar56 + fVar155) * 0.33333334;
  fVar175 = fVar123 - (fVar57 + fVar156) * 0.33333334;
  fVar136 = fVar134 - (fVar95 + fVar176) * 0.33333334;
  local_148 = local_388 - local_1b8;
  fStack_144 = fStack_384 - fStack_1b4;
  fStack_140 = fStack_380 - fStack_1b0;
  fStack_13c = fStack_37c - 0.0;
  fVar135 = (local_4a8->vx).field_0.m128[0];
  fVar56 = (local_4a8->vx).field_0.m128[1];
  fVar57 = (local_4a8->vy).field_0.m128[0];
  fVar95 = (local_4a8->vy).field_0.m128[1];
  fVar96 = (local_4a8->vz).field_0.m128[0];
  fVar97 = (local_4a8->vz).field_0.m128[1];
  fVar216 = local_148 * fVar135 + fStack_144 * fVar57 + fStack_140 * fVar96;
  fVar217 = local_148 * fVar56 + fStack_144 * fVar95 + fStack_140 * fVar97;
  auVar78._4_4_ = fVar217;
  auVar78._0_4_ = fVar216;
  local_158 = local_398 - local_1b8;
  fStack_154 = fStack_394 - fStack_1b4;
  fStack_150 = fStack_390 - fStack_1b0;
  fStack_14c = fStack_38c - 0.0;
  auVar283._0_4_ = local_158 * fVar135 + fStack_154 * fVar57 + fStack_150 * fVar96;
  auVar283._4_4_ = local_158 * fVar56 + fStack_154 * fVar95 + fStack_150 * fVar97;
  local_168 = local_3b8 - local_1b8;
  fStack_164 = fStack_3b4 - fStack_1b4;
  fStack_160 = fStack_3b0 - fStack_1b0;
  fStack_15c = fStack_3ac - 0.0;
  fVar140 = local_168 * fVar135 + fStack_164 * fVar57 + fStack_160 * fVar96;
  fVar141 = local_168 * fVar56 + fStack_164 * fVar95 + fStack_160 * fVar97;
  auVar106._4_4_ = fVar141;
  auVar106._0_4_ = fVar140;
  local_178 = local_3a8 - local_1b8;
  fStack_174 = fStack_3a4 - fStack_1b4;
  fStack_170 = fStack_3a0 - fStack_1b0;
  fStack_16c = fStack_39c - 0.0;
  fVar218 = local_178 * fVar135 + fStack_174 * fVar57 + fStack_170 * fVar96;
  fVar226 = local_178 * fVar56 + fStack_174 * fVar95 + fStack_170 * fVar97;
  auVar266._4_4_ = fVar226;
  auVar266._0_4_ = fVar218;
  local_188 = local_378 - local_1b8;
  fStack_184 = fStack_374 - fStack_1b4;
  fStack_180 = fStack_370 - fStack_1b0;
  fStack_17c = fStack_36c - 0.0;
  fVar206 = local_188 * fVar135 + fStack_184 * fVar57 + fStack_180 * fVar96;
  fVar207 = local_188 * fVar56 + fStack_184 * fVar95 + fStack_180 * fVar97;
  local_268 = (fVar181 + fVar227) * 0.33333334 + local_378;
  fStack_264 = (fVar182 + fVar228) * 0.33333334 + fStack_374;
  fStack_260 = (fVar183 + fVar234) * 0.33333334 + fStack_370;
  fStack_25c = (fVar205 + fVar236) * 0.33333334 + fStack_36c;
  local_198 = local_268 - local_1b8;
  fStack_194 = fStack_264 - fStack_1b4;
  fStack_190 = fStack_260 - fStack_1b0;
  fStack_18c = fStack_25c - 0.0;
  fVar142 = local_198 * fVar135 + fStack_194 * fVar57 + fStack_190 * fVar96;
  fVar155 = local_198 * fVar56 + fStack_194 * fVar95 + fStack_190 * fVar97;
  auVar283._12_4_ = fVar155;
  auVar283._8_4_ = fVar142;
  local_1a8 = fVar157 - local_1b8;
  fStack_1a4 = fVar174 - fStack_1b4;
  fStack_1a0 = fVar175 - fStack_1b0;
  fStack_19c = fVar136 - 0.0;
  fVar99 = local_1a8 * fVar135 + fStack_1a4 * fVar57 + fStack_1a0 * fVar96;
  fVar122 = local_1a8 * fVar56 + fStack_1a4 * fVar95 + fStack_1a0 * fVar97;
  local_1b8 = fVar98 - local_1b8;
  fStack_1b4 = fVar121 - fStack_1b4;
  fStack_1b0 = fVar123 - fStack_1b0;
  fStack_1ac = fVar134 - 0.0;
  fVar57 = local_1b8 * fVar135 + fStack_1b4 * fVar57 + fStack_1b0 * fVar96;
  fVar56 = local_1b8 * fVar56 + fStack_1b4 * fVar95 + fStack_1b0 * fVar97;
  auVar266._12_4_ = fVar56;
  auVar266._8_4_ = fVar57;
  auVar78._8_4_ = fVar206;
  auVar78._12_4_ = fVar207;
  auVar64 = minps(auVar78,auVar283);
  auVar106._8_4_ = fVar99;
  auVar106._12_4_ = fVar122;
  auVar163 = minps(auVar106,auVar266);
  auVar64 = minps(auVar64,auVar163);
  auVar107._4_4_ = fVar217;
  auVar107._0_4_ = fVar216;
  auVar107._8_4_ = fVar206;
  auVar107._12_4_ = fVar207;
  auVar163 = maxps(auVar107,auVar283);
  auVar126._4_4_ = fVar141;
  auVar126._0_4_ = fVar140;
  auVar126._8_4_ = fVar99;
  auVar126._12_4_ = fVar122;
  auVar127 = maxps(auVar126,auVar266);
  auVar164 = maxps(auVar163,auVar127);
  auVar10._4_8_ = auVar127._8_8_;
  auVar10._0_4_ = auVar64._4_4_;
  auVar128._0_8_ = auVar10._0_8_ << 0x20;
  auVar128._8_4_ = auVar64._8_4_;
  auVar128._12_4_ = auVar64._12_4_;
  auVar129._8_8_ = auVar64._8_8_;
  auVar129._0_8_ = auVar128._8_8_;
  auVar163 = minps(auVar64,auVar129);
  auVar11._4_8_ = auVar64._8_8_;
  auVar11._0_4_ = auVar164._4_4_;
  auVar130._0_8_ = auVar11._0_8_ << 0x20;
  auVar130._8_4_ = auVar164._8_4_;
  auVar130._12_4_ = auVar164._12_4_;
  auVar131._8_8_ = auVar164._8_8_;
  auVar131._0_8_ = auVar130._8_8_;
  auVar64 = maxps(auVar164,auVar131);
  auVar79._0_8_ = auVar163._0_8_ & 0x7fffffff7fffffff;
  auVar79._8_4_ = auVar163._8_4_ & 0x7fffffff;
  auVar79._12_4_ = auVar163._12_4_ & 0x7fffffff;
  auVar108._0_8_ = auVar64._0_8_ & 0x7fffffff7fffffff;
  auVar108._8_4_ = auVar64._8_4_ & 0x7fffffff;
  auVar108._12_4_ = auVar64._12_4_ & 0x7fffffff;
  auVar64 = maxps(auVar79,auVar108);
  fStack_324 = auVar64._4_4_;
  fVar135 = fStack_324;
  if (fStack_324 <= auVar64._0_4_) {
    fVar135 = auVar64._0_4_;
  }
  fVar135 = fVar135 * 9.536743e-07;
  local_248 = -fVar135;
  fStack_244 = -fVar135;
  fStack_240 = -fVar135;
  fStack_23c = -fVar135;
  local_4a8 = (LinearSpace3fa *)CONCAT44(fVar207,fVar206);
  local_118 = auVar283._0_4_ - fVar216;
  fStack_114 = auVar283._4_4_ - fVar217;
  fStack_110 = fVar142 - fVar206;
  fStack_10c = fVar155 - fVar207;
  local_128 = fVar140 - auVar283._0_4_;
  fStack_124 = fVar141 - auVar283._4_4_;
  fStack_120 = fVar99 - fVar142;
  fStack_11c = fVar122 - fVar155;
  local_138 = fVar218 - fVar140;
  fStack_134 = fVar226 - fVar141;
  fStack_130 = fVar57 - fVar99;
  fStack_12c = fVar56 - fVar122;
  local_288 = local_378 - local_388;
  fStack_284 = fStack_374 - fStack_384;
  fStack_280 = fStack_370 - fStack_380;
  fStack_27c = fStack_36c - fStack_37c;
  local_298 = local_268 - local_398;
  fStack_294 = fStack_264 - fStack_394;
  fStack_290 = fStack_260 - fStack_390;
  fStack_28c = fStack_25c - fStack_38c;
  local_2a8 = fVar157 - local_3b8;
  fStack_2a4 = fVar174 - fStack_3b4;
  fStack_2a0 = fVar175 - fStack_3b0;
  fStack_29c = fVar136 - fStack_3ac;
  local_2b8 = fVar98 - local_3a8;
  fStack_2b4 = fVar121 - fStack_3a4;
  fStack_2b0 = fVar123 - fStack_3a0;
  fStack_2ac = fVar134 - fStack_39c;
  local_2c8 = uVar50;
  uStack_2c4 = uVar50;
  uStack_2c0 = uVar50;
  uStack_2bc = uVar50;
  uStack_2d4 = local_2d8;
  uStack_2d0 = local_2d8;
  uStack_2cc = local_2d8;
  local_52c = 0;
  uVar47 = 0;
  fVar95 = *(float *)(local_3c0 + k * 4 + 0x30);
  fVar96 = 0.0;
  fVar97 = 1.0;
  fVar134 = 0.0;
  fVar136 = 1.0;
  pPVar38 = prim;
  local_508 = fVar135;
  fStack_504 = fVar135;
  auVar64 = auVar283;
  local_328 = fVar135;
  fStack_320 = fStack_324;
  fStack_31c = fStack_324;
LAB_00a9464a:
  do {
    _local_488 = auVar64;
    local_528 = CONCAT44(fVar97,fVar96);
    fVar181 = 1.0 - fVar96;
    fVar182 = 1.0 - fVar96;
    fVar183 = 1.0 - fVar97;
    fVar205 = 1.0 - fVar97;
    fVar262 = fVar216 * fVar181 + fVar206 * fVar96;
    fVar235 = fVar217 * fVar182 + fVar207 * fVar96;
    fVar237 = fVar216 * fVar183 + fVar206 * fVar97;
    fVar239 = fVar217 * fVar205 + fVar207 * fVar97;
    fVar227 = auVar283._0_4_ * fVar181 + fVar142 * fVar96;
    fVar276 = auVar283._4_4_ * fVar182 + fVar155 * fVar96;
    fVar278 = auVar283._0_4_ * fVar183 + fVar142 * fVar97;
    fVar280 = auVar283._4_4_ * fVar205 + fVar155 * fVar97;
    fVar282 = fVar140 * fVar181 + fVar99 * fVar96;
    fVar285 = fVar141 * fVar182 + fVar122 * fVar96;
    fVar286 = fVar140 * fVar183 + fVar99 * fVar97;
    fVar287 = fVar141 * fVar205 + fVar122 * fVar97;
    fVar242 = fVar181 * fVar218 + fVar96 * fVar57;
    fVar252 = fVar182 * fVar226 + fVar96 * fVar56;
    fVar254 = fVar183 * fVar218 + fVar97 * fVar57;
    fVar256 = fVar205 * fVar226 + fVar97 * fVar56;
    fVar264 = (fVar136 - fVar134) * 0.11111111;
    fVar271 = (fVar136 - fVar134) * 0.0 + fVar134;
    fVar277 = (fVar136 - fVar134) * 0.33333334 + fVar134;
    fVar279 = (fVar136 - fVar134) * 0.6666667 + fVar134;
    fVar281 = (fVar136 - fVar134) * 1.0 + fVar134;
    fVar97 = 1.0 - fVar271;
    fVar182 = 1.0 - fVar277;
    fVar205 = 1.0 - fVar279;
    fVar228 = 1.0 - fVar281;
    fVar234 = fVar227 * fVar97 + fVar282 * fVar271;
    fVar236 = fVar227 * fVar182 + fVar282 * fVar277;
    fVar241 = fVar227 * fVar205 + fVar282 * fVar279;
    fVar251 = fVar227 * fVar228 + fVar282 * fVar281;
    fVar253 = fVar276 * fVar97 + fVar285 * fVar271;
    fVar255 = fVar276 * fVar182 + fVar285 * fVar277;
    fVar257 = fVar276 * fVar205 + fVar285 * fVar279;
    fVar261 = fVar276 * fVar228 + fVar285 * fVar281;
    fVar96 = (fVar262 * fVar97 + fVar227 * fVar271) * fVar97 + fVar271 * fVar234;
    fVar181 = (fVar262 * fVar182 + fVar227 * fVar277) * fVar182 + fVar277 * fVar236;
    fVar183 = (fVar262 * fVar205 + fVar227 * fVar279) * fVar205 + fVar279 * fVar241;
    fVar227 = (fVar262 * fVar228 + fVar227 * fVar281) * fVar228 + fVar281 * fVar251;
    fVar262 = (fVar235 * fVar97 + fVar276 * fVar271) * fVar97 + fVar271 * fVar253;
    fVar263 = (fVar235 * fVar182 + fVar276 * fVar277) * fVar182 + fVar277 * fVar255;
    fVar270 = (fVar235 * fVar205 + fVar276 * fVar279) * fVar205 + fVar279 * fVar257;
    fVar276 = (fVar235 * fVar228 + fVar276 * fVar281) * fVar228 + fVar281 * fVar261;
    fVar234 = fVar234 * fVar97 + (fVar282 * fVar97 + fVar242 * fVar271) * fVar271;
    fVar236 = fVar236 * fVar182 + (fVar282 * fVar182 + fVar242 * fVar277) * fVar277;
    fVar241 = fVar241 * fVar205 + (fVar282 * fVar205 + fVar242 * fVar279) * fVar279;
    fVar251 = fVar251 * fVar228 + (fVar282 * fVar228 + fVar242 * fVar281) * fVar281;
    fVar253 = fVar253 * fVar97 + (fVar285 * fVar97 + fVar252 * fVar271) * fVar271;
    fVar255 = fVar255 * fVar182 + (fVar285 * fVar182 + fVar252 * fVar277) * fVar277;
    fVar257 = fVar257 * fVar205 + (fVar285 * fVar205 + fVar252 * fVar279) * fVar279;
    fVar261 = fVar261 * fVar228 + (fVar285 * fVar228 + fVar252 * fVar281) * fVar281;
    local_368 = fVar97 * fVar96 + fVar271 * fVar234;
    fStack_364 = fVar182 * fVar181 + fVar277 * fVar236;
    fStack_360 = fVar205 * fVar183 + fVar279 * fVar241;
    fStack_35c = fVar228 * fVar227 + fVar281 * fVar251;
    local_238 = fVar97 * fVar262 + fVar271 * fVar253;
    fStack_234 = fVar182 * fVar263 + fVar277 * fVar255;
    fStack_230 = fVar205 * fVar270 + fVar279 * fVar257;
    fStack_22c = fVar228 * fVar276 + fVar281 * fVar261;
    fVar236 = (fVar236 - fVar181) * 3.0 * fVar264;
    fVar241 = (fVar241 - fVar183) * 3.0 * fVar264;
    fVar251 = (fVar251 - fVar227) * 3.0 * fVar264;
    fVar255 = (fVar255 - fVar263) * 3.0 * fVar264;
    fVar257 = (fVar257 - fVar270) * 3.0 * fVar264;
    fVar261 = (fVar261 - fVar276) * 3.0 * fVar264;
    local_338._4_4_ = fStack_360;
    local_338._0_4_ = fStack_364;
    local_338._8_4_ = fStack_35c;
    local_338._12_4_ = 0;
    local_1d8._4_4_ = fStack_230;
    local_1d8._0_4_ = fStack_234;
    local_348 = local_368 + (fVar234 - fVar96) * 3.0 * fVar264;
    fStack_344 = fStack_364 + fVar236;
    fStack_340 = fStack_360 + fVar241;
    fStack_33c = fStack_35c + fVar251;
    fVar96 = local_238 + (fVar253 - fVar262) * 3.0 * fVar264;
    fVar181 = fStack_234 + fVar255;
    fVar183 = fStack_230 + fVar257;
    fVar227 = fStack_22c + fVar261;
    local_358._0_4_ = fStack_364 - fVar236;
    local_358._4_4_ = fStack_360 - fVar241;
    local_358._8_4_ = fStack_35c - fVar251;
    local_358._12_4_ = 0;
    local_518._0_4_ = fStack_234 - fVar255;
    local_518._4_4_ = fStack_230 - fVar257;
    fStack_510 = fStack_22c - fVar261;
    fStack_50c = 0.0;
    fVar234 = fVar278 * fVar97 + fVar286 * fVar271;
    fVar236 = fVar278 * fVar182 + fVar286 * fVar277;
    fVar241 = fVar278 * fVar205 + fVar286 * fVar279;
    fVar251 = fVar278 * fVar228 + fVar286 * fVar281;
    fVar253 = fVar280 * fVar97 + fVar287 * fVar271;
    fVar255 = fVar280 * fVar182 + fVar287 * fVar277;
    fVar257 = fVar280 * fVar205 + fVar287 * fVar279;
    fVar261 = fVar280 * fVar228 + fVar287 * fVar281;
    fVar262 = (fVar237 * fVar97 + fVar278 * fVar271) * fVar97 + fVar271 * fVar234;
    fVar263 = (fVar237 * fVar182 + fVar278 * fVar277) * fVar182 + fVar277 * fVar236;
    fVar270 = (fVar237 * fVar205 + fVar278 * fVar279) * fVar205 + fVar279 * fVar241;
    fVar276 = (fVar237 * fVar228 + fVar278 * fVar281) * fVar228 + fVar281 * fVar251;
    fVar282 = (fVar239 * fVar97 + fVar280 * fVar271) * fVar97 + fVar271 * fVar253;
    fVar285 = (fVar239 * fVar182 + fVar280 * fVar277) * fVar182 + fVar277 * fVar255;
    fVar238 = (fVar239 * fVar205 + fVar280 * fVar279) * fVar205 + fVar279 * fVar257;
    fVar240 = (fVar239 * fVar228 + fVar280 * fVar281) * fVar228 + fVar281 * fVar261;
    fVar278 = fVar234 * fVar97 + (fVar286 * fVar97 + fVar254 * fVar271) * fVar271;
    fVar280 = fVar236 * fVar182 + (fVar286 * fVar182 + fVar254 * fVar277) * fVar277;
    fVar235 = fVar241 * fVar205 + (fVar286 * fVar205 + fVar254 * fVar279) * fVar279;
    fVar237 = fVar251 * fVar228 + (fVar286 * fVar228 + fVar254 * fVar281) * fVar281;
    fVar239 = fVar253 * fVar97 + (fVar287 * fVar97 + fVar256 * fVar271) * fVar271;
    fVar242 = fVar255 * fVar182 + (fVar287 * fVar182 + fVar256 * fVar277) * fVar277;
    fVar252 = fVar257 * fVar205 + (fVar287 * fVar205 + fVar256 * fVar279) * fVar279;
    fVar254 = fVar261 * fVar228 + (fVar287 * fVar228 + fVar256 * fVar281) * fVar281;
    fVar253 = fVar97 * fVar262 + fVar271 * fVar278;
    fVar255 = fVar182 * fVar263 + fVar277 * fVar280;
    fVar257 = fVar205 * fVar270 + fVar279 * fVar235;
    fVar261 = fVar228 * fVar276 + fVar281 * fVar237;
    fVar234 = fVar97 * fVar282 + fVar271 * fVar239;
    fVar236 = fVar182 * fVar285 + fVar277 * fVar242;
    fVar241 = fVar205 * fVar238 + fVar279 * fVar252;
    fVar251 = fVar228 * fVar240 + fVar281 * fVar254;
    fVar97 = (fVar280 - fVar263) * 3.0 * fVar264;
    fVar182 = (fVar235 - fVar270) * 3.0 * fVar264;
    fVar205 = (fVar237 - fVar276) * 3.0 * fVar264;
    fVar228 = (fVar242 - fVar285) * 3.0 * fVar264;
    fVar263 = (fVar252 - fVar238) * 3.0 * fVar264;
    fVar270 = (fVar254 - fVar240) * 3.0 * fVar264;
    local_1e8._4_4_ = fVar257;
    local_1e8._0_4_ = fVar255;
    local_1e8._8_4_ = fVar261;
    local_1e8._12_4_ = 0;
    local_208._4_4_ = fVar241;
    local_208._0_4_ = fVar236;
    local_208._8_4_ = fVar251;
    local_208._12_4_ = 0;
    local_228 = fVar253 + (fVar278 - fVar262) * 3.0 * fVar264;
    fStack_224 = fVar255 + fVar97;
    fStack_220 = fVar257 + fVar182;
    fStack_21c = fVar261 + fVar205;
    local_1f8 = fVar234 + (fVar239 - fVar282) * 3.0 * fVar264;
    fStack_1f4 = fVar236 + fVar228;
    fStack_1f0 = fVar241 + fVar263;
    fStack_1ec = fVar251 + fVar270;
    local_1c8._0_4_ = fVar255 - fVar97;
    local_1c8._4_4_ = fVar257 - fVar182;
    local_1c8._8_4_ = fVar261 - fVar205;
    local_1c8._12_4_ = 0;
    local_218._0_4_ = fVar236 - fVar228;
    local_218._4_4_ = fVar241 - fVar263;
    local_218._8_4_ = fVar251 - fVar270;
    local_218._12_4_ = 0;
    fVar97 = (fVar255 - fStack_364) + (fVar253 - local_368);
    fVar182 = (fVar257 - fStack_360) + (fVar255 - fStack_364);
    fVar205 = (fVar261 - fStack_35c) + (fVar257 - fStack_360);
    fVar228 = (fVar261 - fStack_35c) + 0.0;
    local_1d8._8_4_ = fStack_22c;
    local_1d8._12_4_ = 0;
    fVar262 = (fVar236 - fStack_234) + (fVar234 - local_238);
    fVar263 = (fVar241 - fStack_230) + (fVar236 - fStack_234);
    fVar270 = (fVar251 - fStack_22c) + (fVar241 - fStack_230);
    fVar276 = (fVar251 - fStack_22c) + 0.0;
    auVar198._0_8_ =
         CONCAT44(fStack_234 * fVar182 - fStack_364 * fVar263,
                  local_238 * fVar97 - local_368 * fVar262);
    auVar198._8_4_ = fStack_230 * fVar205 - fStack_360 * fVar270;
    auVar198._12_4_ = fStack_22c * fVar228 - fStack_35c * fVar276;
    auVar145._0_4_ = fVar96 * fVar97 - local_348 * fVar262;
    auVar145._4_4_ = fVar181 * fVar182 - fStack_344 * fVar263;
    auVar145._8_4_ = fVar183 * fVar205 - fStack_340 * fVar270;
    auVar145._12_4_ = fVar227 * fVar228 - fStack_33c * fVar276;
    auVar165._0_8_ =
         CONCAT44((float)local_518._4_4_ * fVar182 - fVar263 * local_358._4_4_,
                  (float)local_518._0_4_ * fVar97 - fVar262 * local_358._0_4_);
    auVar165._8_4_ = fStack_510 * fVar205 - fVar270 * local_358._8_4_;
    auVar165._12_4_ = fVar228 * 0.0 - fVar276 * 0.0;
    auVar259._0_4_ = fVar97 * fStack_234 - fVar262 * fStack_364;
    auVar259._4_4_ = fVar182 * fStack_230 - fVar263 * fStack_360;
    auVar259._8_4_ = fVar205 * fStack_22c - fVar270 * fStack_35c;
    auVar259._12_4_ = fVar228 * 0.0 - fVar276 * 0.0;
    auVar219._0_8_ =
         CONCAT44(fVar236 * fVar182 - fVar255 * fVar263,fVar234 * fVar97 - fVar253 * fVar262);
    auVar219._8_4_ = fVar241 * fVar205 - fVar257 * fVar270;
    auVar219._12_4_ = fVar251 * fVar228 - fVar261 * fVar276;
    auVar267._0_4_ = local_1f8 * fVar97 - local_228 * fVar262;
    auVar267._4_4_ = fStack_1f4 * fVar182 - fStack_224 * fVar263;
    auVar267._8_4_ = fStack_1f0 * fVar205 - fStack_220 * fVar270;
    auVar267._12_4_ = fStack_1ec * fVar228 - fStack_21c * fVar276;
    auVar209._0_8_ =
         CONCAT44(local_218._4_4_ * fVar182 - fVar263 * local_1c8._4_4_,
                  local_218._0_4_ * fVar97 - fVar262 * local_1c8._0_4_);
    auVar209._8_4_ = local_218._8_4_ * fVar205 - fVar270 * local_1c8._8_4_;
    auVar209._12_4_ = fVar228 * 0.0 - fVar276 * 0.0;
    auVar80._0_4_ = fVar97 * fVar236 - fVar262 * fVar255;
    auVar80._4_4_ = fVar182 * fVar241 - fVar263 * fVar257;
    auVar80._8_4_ = fVar205 * fVar251 - fVar270 * fVar261;
    auVar80._12_4_ = fVar228 * 0.0 - fVar276 * 0.0;
    auVar109._8_4_ = auVar198._8_4_;
    auVar109._0_8_ = auVar198._0_8_;
    auVar109._12_4_ = auVar198._12_4_;
    auVar64 = minps(auVar109,auVar145);
    auVar164 = maxps(auVar198,auVar145);
    auVar146._8_4_ = auVar165._8_4_;
    auVar146._0_8_ = auVar165._0_8_;
    auVar146._12_4_ = auVar165._12_4_;
    auVar163 = minps(auVar146,auVar259);
    auVar64 = minps(auVar64,auVar163);
    auVar163 = maxps(auVar165,auVar259);
    auVar127 = maxps(auVar164,auVar163);
    auVar147._8_4_ = auVar219._8_4_;
    auVar147._0_8_ = auVar219._0_8_;
    auVar147._12_4_ = auVar219._12_4_;
    auVar163 = minps(auVar147,auVar267);
    auVar220 = maxps(auVar219,auVar267);
    auVar166._8_4_ = auVar209._8_4_;
    auVar166._0_8_ = auVar209._0_8_;
    auVar166._12_4_ = auVar209._12_4_;
    auVar164 = minps(auVar166,auVar80);
    auVar163 = minps(auVar163,auVar164);
    auVar64 = minps(auVar64,auVar163);
    auVar163 = maxps(auVar209,auVar80);
    auVar163 = maxps(auVar220,auVar163);
    auVar163 = maxps(auVar127,auVar163);
    auVar199._0_4_ =
         -(uint)(local_248 <= auVar163._0_4_ && auVar64._0_4_ <= local_508) & local_258._0_4_;
    auVar199._4_4_ =
         -(uint)(fStack_244 <= auVar163._4_4_ && auVar64._4_4_ <= fStack_504) & local_258._4_4_;
    auVar199._8_4_ =
         -(uint)(fStack_240 <= auVar163._8_4_ && auVar64._8_4_ <= fVar135) & local_258._8_4_;
    auVar199._12_4_ =
         -(uint)(fStack_23c <= auVar163._12_4_ && auVar64._12_4_ <= fVar135) & local_258._12_4_;
    iVar37 = movmskps((int)pPVar38,auVar199);
    auVar64 = _local_488;
    if (iVar37 != 0) {
      fVar97 = (fVar255 - fVar253) + (fStack_364 - local_368);
      fVar182 = (fVar257 - fVar255) + (fStack_360 - fStack_364);
      fVar205 = (fVar261 - fVar257) + (fStack_35c - fStack_360);
      fVar228 = (0.0 - fVar261) + (0.0 - fStack_35c);
      fVar262 = (fVar236 - fVar234) + (fStack_234 - local_238);
      fVar263 = (fVar241 - fVar236) + (fStack_230 - fStack_234);
      fVar270 = (fVar251 - fVar241) + (fStack_22c - fStack_230);
      fVar276 = (0.0 - fVar251) + (0.0 - fStack_22c);
      auVar272._0_8_ =
           CONCAT44(fStack_234 * fVar182 - fStack_364 * fVar263,
                    local_238 * fVar97 - local_368 * fVar262);
      auVar272._8_4_ = fStack_230 * fVar205 - fStack_360 * fVar270;
      auVar272._12_4_ = fStack_22c * fVar228 - fStack_35c * fVar276;
      auVar148._0_4_ = fVar96 * fVar97 - local_348 * fVar262;
      auVar148._4_4_ = fVar181 * fVar182 - fStack_344 * fVar263;
      auVar148._8_4_ = fVar183 * fVar205 - fStack_340 * fVar270;
      auVar148._12_4_ = fVar227 * fVar228 - fStack_33c * fVar276;
      auVar179._0_8_ =
           CONCAT44((float)local_518._4_4_ * fVar182 - local_358._4_4_ * fVar263,
                    (float)local_518._0_4_ * fVar97 - local_358._0_4_ * fVar262);
      auVar179._8_4_ = fStack_510 * fVar205 - local_358._8_4_ * fVar270;
      auVar179._12_4_ = fVar228 * 0.0 - fVar276 * 0.0;
      auVar167._0_4_ = fStack_234 * fVar97 - fStack_364 * fVar262;
      auVar167._4_4_ = fStack_230 * fVar182 - fStack_360 * fVar263;
      auVar167._8_4_ = fStack_22c * fVar205 - fStack_35c * fVar270;
      auVar167._12_4_ = fVar228 * 0.0 - fVar276 * 0.0;
      auVar132._0_8_ =
           CONCAT44(fVar236 * fVar182 - fVar255 * fVar263,fVar234 * fVar97 - fVar253 * fVar262);
      auVar132._8_4_ = fVar241 * fVar205 - fVar257 * fVar270;
      auVar132._12_4_ = fVar251 * fVar228 - fVar261 * fVar276;
      auVar210._0_4_ = local_1f8 * fVar97 - local_228 * fVar262;
      auVar210._4_4_ = fStack_1f4 * fVar182 - fStack_224 * fVar263;
      auVar210._8_4_ = fStack_1f0 * fVar205 - fStack_220 * fVar270;
      auVar210._12_4_ = fStack_1ec * fVar228 - fStack_21c * fVar276;
      auVar229._0_8_ =
           CONCAT44(local_218._4_4_ * fVar182 - local_1c8._4_4_ * fVar263,
                    local_218._0_4_ * fVar97 - local_1c8._0_4_ * fVar262);
      auVar229._8_4_ = local_218._8_4_ * fVar205 - local_1c8._8_4_ * fVar270;
      auVar229._12_4_ = fVar228 * 0.0 - fVar276 * 0.0;
      auVar81._0_4_ = fVar97 * fVar236 - fVar262 * fVar255;
      auVar81._4_4_ = fVar182 * fVar241 - fVar263 * fVar257;
      auVar81._8_4_ = fVar205 * fVar251 - fVar270 * fVar261;
      auVar81._12_4_ = fVar228 * 0.0 - fVar276 * 0.0;
      auVar110._8_4_ = auVar272._8_4_;
      auVar110._0_8_ = auVar272._0_8_;
      auVar110._12_4_ = auVar272._12_4_;
      auVar163 = minps(auVar110,auVar148);
      auVar127 = maxps(auVar272,auVar148);
      auVar149._8_4_ = auVar179._8_4_;
      auVar149._0_8_ = auVar179._0_8_;
      auVar149._12_4_ = auVar179._12_4_;
      auVar164 = minps(auVar149,auVar167);
      auVar163 = minps(auVar163,auVar164);
      auVar164 = maxps(auVar179,auVar167);
      auVar273 = maxps(auVar127,auVar164);
      auVar150._8_4_ = auVar132._8_4_;
      auVar150._0_8_ = auVar132._0_8_;
      auVar150._12_4_ = auVar132._12_4_;
      auVar127 = minps(auVar150,auVar210);
      auVar164 = maxps(auVar132,auVar210);
      auVar168._8_4_ = auVar229._8_4_;
      auVar168._0_8_ = auVar229._0_8_;
      auVar168._12_4_ = auVar229._12_4_;
      auVar220 = minps(auVar168,auVar81);
      auVar127 = minps(auVar127,auVar220);
      auVar163 = minps(auVar163,auVar127);
      auVar127 = maxps(auVar229,auVar81);
      auVar164 = maxps(auVar164,auVar127);
      auVar164 = maxps(auVar273,auVar164);
      auVar274._0_4_ =
           -(uint)(local_248 <= auVar164._0_4_ && auVar163._0_4_ <= local_508) & auVar199._0_4_;
      auVar274._4_4_ =
           -(uint)(fStack_244 <= auVar164._4_4_ && auVar163._4_4_ <= fStack_504) & auVar199._4_4_;
      auVar274._8_4_ =
           -(uint)(fStack_240 <= auVar164._8_4_ && auVar163._8_4_ <= fVar135) & auVar199._8_4_;
      auVar274._12_4_ =
           -(uint)(fStack_23c <= auVar164._12_4_ && auVar163._12_4_ <= fVar135) & auVar199._12_4_;
      uVar51 = movmskps(iVar37,auVar274);
      if (uVar51 != 0) {
        auStack_318[uVar47] = uVar51 & 0xff;
        *(ulong *)(afStack_108 + uVar47 * 2) = CONCAT44(fVar136,fVar134);
        *(undefined8 *)(afStack_58 + uVar47 * 2) = local_528;
        uVar45 = uVar47;
        uVar47 = (ulong)((int)uVar47 + 1);
      }
    }
LAB_00a94cbd:
    _local_488 = auVar64;
    auVar164 = _local_488;
    auVar163 = _local_518;
    bVar42 = SUB41(local_52c,0);
    if ((int)uVar47 == 0) {
      if (local_52c != 0) {
        return bVar42;
      }
      fVar135 = *(float *)(pRVar35 + k * 4 + 0x80);
      auVar120._4_4_ = -(uint)(fStack_274 <= fVar135);
      auVar120._0_4_ = -(uint)(local_278 <= fVar135);
      auVar120._8_4_ = -(uint)(fStack_270 <= fVar135);
      auVar120._12_4_ = -(uint)(fStack_26c <= fVar135);
      uVar50 = movmskps((int)uVar45,auVar120);
      uVar50 = (uint)uVar46 & uVar50;
      if (uVar50 == 0) {
        return bVar42;
      }
      goto LAB_00a93ced;
    }
    uVar53 = (int)uVar47 - 1;
    pPVar38 = (Primitive *)(ulong)uVar53;
    uVar51 = auStack_318[(long)pPVar38];
    fVar96 = afStack_58[(long)pPVar38 * 2];
    fVar97 = afStack_58[(long)pPVar38 * 2 + 1];
    uVar43 = 0;
    if (uVar51 != 0) {
      for (; (uVar51 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
      }
    }
    uVar51 = uVar51 - 1 & uVar51;
    auStack_318[(long)pPVar38] = uVar51;
    if (uVar51 == 0) {
      uVar47 = (ulong)uVar53;
    }
    uVar44 = uVar43 + 1;
    uVar45 = uVar44;
    if ((long)uVar44 < 0) {
      uVar45 = (ulong)((uint)uVar44 & 1) | uVar44 >> 1;
    }
    fVar181 = afStack_108[(long)pPVar38 * 2];
    fVar182 = afStack_108[(long)pPVar38 * 2 + 1];
    fVar134 = fVar181 * (1.0 - (float)uVar43 * 0.33333334) + fVar182 * (float)uVar43 * 0.33333334;
    fVar136 = fVar181 * (1.0 - (float)uVar44 * 0.33333334) + fVar182 * (float)uVar44 * 0.33333334;
    fVar205 = fVar181 * 0.0 + fVar182 * 0.0;
    fVar182 = fVar181 * 0.0 + fVar182 * 0.0;
    fVar181 = fVar136 - fVar134;
    auVar64 = _local_488;
    if (fVar181 < 0.16666667) {
      fVar261 = 1.0 - fVar96;
      fVar262 = 1.0 - fVar96;
      fVar263 = 1.0 - fVar97;
      fVar270 = 1.0 - fVar97;
      fVar228 = fVar216 * fVar261 + fVar206 * fVar96;
      fVar234 = fVar217 * fVar262 + fVar207 * fVar96;
      fVar236 = fVar216 * fVar263 + fVar206 * fVar97;
      fVar241 = fVar217 * fVar270 + fVar207 * fVar97;
      fVar251 = auVar283._0_4_ * fVar261 + fVar142 * fVar96;
      fVar253 = auVar283._4_4_ * fVar262 + fVar155 * fVar96;
      fVar255 = auVar283._0_4_ * fVar263 + fVar142 * fVar97;
      fVar257 = auVar283._4_4_ * fVar270 + fVar155 * fVar97;
      fVar285 = fVar140 * fVar261 + fVar99 * fVar96;
      fVar240 = fVar141 * fVar262 + fVar122 * fVar96;
      fVar264 = fVar140 * fVar263 + fVar99 * fVar97;
      fVar277 = fVar141 * fVar270 + fVar122 * fVar97;
      fVar242 = (fVar261 * fVar218 + fVar96 * fVar57) - fVar285;
      fVar252 = (fVar262 * fVar226 + fVar96 * fVar56) - fVar240;
      fVar254 = (fVar263 * fVar218 + fVar97 * fVar57) - fVar264;
      fVar282 = (fVar270 * fVar226 + fVar97 * fVar56) - fVar277;
      fVar263 = fVar134 * (fVar285 - fVar251) + fVar251;
      fVar270 = fVar134 * (fVar240 - fVar253) + fVar253;
      fVar276 = fVar134 * (fVar264 - fVar255) + fVar255;
      fVar278 = fVar134 * (fVar277 - fVar257) + fVar257;
      fVar238 = (fVar285 - fVar251) * fVar136 + fVar251;
      fVar256 = (fVar240 - fVar253) * fVar136 + fVar253;
      fVar271 = (fVar264 - fVar255) * fVar136 + fVar255;
      fVar279 = (fVar277 - fVar257) * fVar136 + fVar257;
      fVar261 = fVar134 * (fVar251 - fVar228) + fVar228;
      fVar262 = fVar134 * (fVar253 - fVar234) + fVar234;
      local_508 = fVar134 * (fVar255 - fVar236) + fVar236;
      fStack_504 = fVar134 * (fVar257 - fVar241) + fVar241;
      fVar261 = (fVar263 - fVar261) * fVar134 + fVar261;
      fVar262 = (fVar270 - fVar262) * fVar134 + fVar262;
      local_508 = (fVar276 - local_508) * fVar134 + local_508;
      fStack_504 = (fVar278 - fStack_504) * fVar134 + fStack_504;
      fVar280 = (((fVar134 * fVar242 + fVar285) - fVar263) * fVar134 + fVar263) - fVar261;
      fVar235 = (((fVar134 * fVar252 + fVar240) - fVar270) * fVar134 + fVar270) - fVar262;
      fVar237 = (((fVar134 * fVar254 + fVar264) - fVar276) * fVar134 + fVar276) - local_508;
      fVar239 = (((fVar134 * fVar282 + fVar277) - fVar278) * fVar134 + fVar278) - fStack_504;
      fVar261 = fVar134 * fVar280 + fVar261;
      fVar262 = fVar134 * fVar235 + fVar262;
      local_508 = fVar134 * fVar237 + local_508;
      fStack_504 = fVar134 * fVar239 + fStack_504;
      auVar111._0_4_ = (fVar251 - fVar228) * fVar136 + fVar228;
      auVar111._4_4_ = (fVar253 - fVar234) * fVar136 + fVar234;
      auVar111._8_4_ = (fVar255 - fVar236) * fVar136 + fVar236;
      auVar111._12_4_ = (fVar257 - fVar241) * fVar136 + fVar241;
      fVar263 = (fVar238 - auVar111._0_4_) * fVar136 + auVar111._0_4_;
      fVar270 = (fVar256 - auVar111._4_4_) * fVar136 + auVar111._4_4_;
      fVar276 = (fVar271 - auVar111._8_4_) * fVar136 + auVar111._8_4_;
      fVar278 = (fVar279 - auVar111._12_4_) * fVar136 + auVar111._12_4_;
      fVar234 = (((fVar242 * fVar136 + fVar285) - fVar238) * fVar136 + fVar238) - fVar263;
      fVar236 = (((fVar252 * fVar136 + fVar240) - fVar256) * fVar136 + fVar256) - fVar270;
      fVar241 = (((fVar254 * fVar136 + fVar264) - fVar271) * fVar136 + fVar271) - fVar276;
      fVar251 = (((fVar282 * fVar136 + fVar277) - fVar279) * fVar136 + fVar279) - fVar278;
      fVar263 = fVar136 * fVar234 + fVar263;
      fVar270 = fVar136 * fVar236 + fVar270;
      fVar276 = fVar136 * fVar241 + fVar276;
      fVar278 = fVar136 * fVar251 + fVar278;
      fVar228 = fVar181 * 0.33333334;
      fVar280 = fVar280 * (float)DAT_01f7ff50 * fVar228 + fVar261;
      fVar235 = fVar235 * DAT_01f7ff50._4_4_ * fVar228 + fVar262;
      fVar237 = fVar237 * DAT_01f7ff50._8_4_ * fVar228 + local_508;
      fVar239 = fVar239 * DAT_01f7ff50._12_4_ * fVar228 + fStack_504;
      fVar242 = fVar263 - fVar228 * fVar234 * (float)DAT_01f7ff50;
      fVar252 = fVar270 - fVar228 * fVar236 * DAT_01f7ff50._4_4_;
      fVar254 = fVar276 - fVar228 * fVar241 * DAT_01f7ff50._8_4_;
      fVar282 = fVar278 - fVar228 * fVar251 * DAT_01f7ff50._12_4_;
      auVar12._4_8_ = auVar111._8_8_;
      auVar12._0_4_ = fVar262;
      auVar112._0_8_ = auVar12._0_8_ << 0x20;
      auVar112._8_4_ = local_508;
      auVar112._12_4_ = fStack_504;
      local_518 = (undefined1  [8])auVar112._8_8_;
      fVar251 = (fVar276 - fVar263) + (local_508 - fVar261);
      fVar253 = (fVar278 - fVar270) + (fStack_504 - fVar262);
      auVar221._0_4_ = fVar252 * fVar253;
      auVar221._4_4_ = fVar252 * fVar253;
      auVar221._8_4_ = fVar282 * fVar253;
      auVar221._12_4_ = fVar282 * fVar253;
      fVar228 = fVar261 * fVar251 + fVar262 * fVar253;
      fVar234 = local_508 * fVar251 + fStack_504 * fVar253;
      fVar255 = fVar280 * fVar251 + fVar235 * fVar253;
      fVar257 = fVar237 * fVar251 + fVar239 * fVar253;
      fVar285 = fVar242 * fVar251 + auVar221._0_4_;
      auVar200._0_8_ = CONCAT44(fVar252 * fVar251 + auVar221._4_4_,fVar285);
      auVar200._8_4_ = fVar254 * fVar251 + auVar221._8_4_;
      auVar200._12_4_ = fVar282 * fVar251 + auVar221._12_4_;
      fVar241 = fVar251 * fVar263 + fVar253 * fVar270;
      fVar238 = fVar251 * fVar276 + fVar253 * fVar278;
      auVar13._4_8_ = auVar221._8_8_;
      auVar13._0_4_ = fVar235 * fVar251 + fVar235 * fVar253;
      auVar222._0_8_ = auVar13._0_8_ << 0x20;
      auVar222._8_4_ = fVar257;
      auVar222._12_4_ = fVar239 * fVar251 + fVar239 * fVar253;
      fVar236 = fVar255;
      if (fVar255 <= fVar228) {
        fVar236 = fVar228;
        fVar228 = fVar255;
      }
      auVar223._8_8_ = auVar222._8_8_;
      auVar223._0_8_ = auVar223._8_8_;
      auVar82._8_4_ = auVar200._8_4_;
      auVar82._0_8_ = auVar200._0_8_;
      auVar82._12_4_ = auVar200._12_4_;
      if (fVar241 <= fVar285) {
        auVar82._0_4_ = fVar241;
      }
      if (auVar82._0_4_ <= fVar228) {
        fVar228 = auVar82._0_4_;
      }
      auVar14._4_8_ = auVar82._8_8_;
      auVar14._0_4_ = fVar251 * fVar270 + fVar253 * fVar270;
      auVar83._0_8_ = auVar14._0_8_ << 0x20;
      auVar83._8_4_ = fVar238;
      auVar83._12_4_ = fVar251 * fVar278 + fVar253 * fVar278;
      if (fVar241 <= fVar285) {
        fVar241 = fVar285;
      }
      auVar84._8_8_ = auVar83._8_8_;
      auVar84._0_8_ = auVar84._8_8_;
      if (fVar241 <= fVar236) {
        fVar241 = fVar236;
      }
      if (fVar257 <= fVar234) {
        auVar223._0_4_ = fVar234;
        fVar234 = fVar257;
      }
      auVar113._8_4_ = auVar200._8_4_;
      auVar113._0_8_ = auVar200._8_8_;
      auVar113._12_4_ = auVar200._12_4_;
      if (fVar238 <= auVar200._8_4_) {
        auVar113._0_4_ = fVar238;
      }
      if (auVar113._0_4_ <= fVar234) {
        fVar234 = auVar113._0_4_;
      }
      if (fVar238 <= auVar200._8_4_) {
        auVar84._0_4_ = auVar200._8_4_;
      }
      if (auVar84._0_4_ <= auVar223._0_4_) {
        auVar84._0_4_ = auVar223._0_4_;
      }
      fVar236 = auVar84._0_4_;
      if ((0.0001 <= fVar228) || (fVar236 <= -0.0001)) break;
      goto LAB_00a9501f;
    }
  } while( true );
  if ((fVar234 < 0.0001 && -0.0001 < fVar241) ||
     ((fVar228 < 0.0001 && -0.0001 < fVar241 ||
      (uVar45 = CONCAT71((int7)(uVar45 >> 8),fVar181 < 0.001), fVar234 < 0.0001 && -0.0001 < fVar236
      )))) {
LAB_00a9501f:
    local_488._4_4_ = fVar278;
    local_488._0_4_ = fVar276;
    auVar64 = _local_488;
    fVar253 = (float)(~-(uint)(fVar228 < 0.0) & 0x3f800000 | -(uint)(fVar228 < 0.0) & 0xbf800000);
    fVar255 = (float)(~-(uint)(fVar241 < 0.0) & 0x3f800000 | -(uint)(fVar241 < 0.0) & 0xbf800000);
    fVar251 = 0.0;
    if ((fVar253 == fVar255) && (!NAN(fVar253) && !NAN(fVar255))) {
      fVar251 = INFINITY;
    }
    fVar257 = 0.0;
    if ((fVar253 == fVar255) && (!NAN(fVar253) && !NAN(fVar255))) {
      fVar257 = -INFINITY;
    }
    fVar285 = (float)(~-(uint)(fVar234 < 0.0) & 0x3f800000 | -(uint)(fVar234 < 0.0) & 0xbf800000);
    if ((fVar253 != fVar285) || (fVar238 = fVar257, NAN(fVar253) || NAN(fVar285))) {
      if ((fVar234 != fVar228) || (NAN(fVar234) || NAN(fVar228))) {
        fVar234 = -fVar228 / (fVar234 - fVar228);
        fVar234 = (1.0 - fVar234) * 0.0 + fVar234;
        fVar238 = fVar234;
      }
      else {
        fVar234 = 0.0;
        if ((fVar228 != 0.0) || (fVar238 = 1.0, NAN(fVar228))) {
          fVar234 = INFINITY;
          fVar238 = -INFINITY;
        }
      }
      if (fVar234 <= fVar251) {
        fVar251 = fVar234;
      }
      if (fVar238 <= fVar257) {
        fVar238 = fVar257;
      }
    }
    uVar45 = (ulong)(fVar236 < 0.0);
    fVar228 = *(float *)(&DAT_01f80eb4 + uVar45 * 4);
    if ((fVar255 != fVar228) || (fVar234 = fVar238, NAN(fVar255) || NAN(fVar228))) {
      if ((fVar236 != fVar241) || (NAN(fVar236) || NAN(fVar241))) {
        fVar253 = -fVar241 / (fVar236 - fVar241);
        fVar253 = (1.0 - fVar253) * 0.0 + fVar253;
        fVar234 = fVar253;
      }
      else {
        fVar253 = 0.0;
        if ((fVar241 != 0.0) || (fVar234 = 1.0, NAN(fVar241))) {
          fVar253 = INFINITY;
          fVar234 = -INFINITY;
        }
      }
      if (fVar253 <= fVar251) {
        fVar251 = fVar253;
      }
      if (fVar234 <= fVar238) {
        fVar234 = fVar238;
      }
    }
    if ((fVar285 != fVar228) || (NAN(fVar285) || NAN(fVar228))) {
      fVar251 = (float)(~-(uint)(fVar251 < 1.0) & 0x3f800000 |
                       (uint)fVar251 & -(uint)(fVar251 < 1.0));
      fVar234 = (float)(~-(uint)(fVar234 < 1.0) & (uint)fVar234 |
                       -(uint)(fVar234 < 1.0) & 0x3f800000);
    }
    fVar251 = (float)(~-(uint)(fVar251 < 0.0) & (uint)fVar251);
    fVar228 = (float)(~-(uint)(fVar234 < 1.0) & 0x3f800000 | (uint)fVar234 & -(uint)(fVar234 < 1.0))
    ;
    if (fVar251 <= fVar228) {
      fVar251 = fVar251 + -0.1;
      fVar228 = fVar228 + 0.1;
      uVar51 = -(uint)(fVar228 < 1.0);
      fVar251 = (float)(~-(uint)(fVar251 < 0.0) & (uint)fVar251);
      fVar228 = (float)(~uVar51 & 0x3f800000 | (uint)fVar228 & uVar51);
      fVar285 = 1.0 - fVar251;
      fVar238 = 1.0 - fVar251;
      fVar240 = 1.0 - fVar228;
      fVar256 = 1.0 - fVar228;
      fStack_510 = auVar163._8_4_;
      fStack_50c = auVar163._12_4_;
      fVar234 = fVar261 * fVar285 + local_508 * fVar251;
      fVar241 = fVar262 * fVar238 + fStack_504 * fVar251;
      fVar253 = fVar261 * fVar240 + fStack_510 * fVar228;
      fVar255 = fVar262 * fVar256 + fStack_50c * fVar228;
      fVar257 = fVar280 * fVar285 + fVar237 * fVar251;
      fVar261 = fVar235 * fVar238 + fVar239 * fVar251;
      fVar262 = fVar280 * fVar240 + fVar237 * fVar228;
      fVar235 = fVar235 * fVar256 + fVar239 * fVar228;
      fVar237 = fVar242 * fVar285 + fVar254 * fVar251;
      fVar239 = fVar252 * fVar238 + fVar282 * fVar251;
      fVar242 = fVar242 * fVar240 + fVar254 * fVar228;
      fVar252 = fVar252 * fVar256 + fVar282 * fVar228;
      fVar254 = fVar285 * fVar263 + fVar276 * fVar251;
      fVar282 = fVar238 * fVar270 + fVar278 * fVar251;
      fVar263 = fVar240 * fVar263 + fVar183 * fVar228;
      fVar270 = fVar256 * fVar270 + fVar227 * fVar228;
      fVar280 = fVar96 * (1.0 - fVar228);
      fVar96 = fVar96 * (1.0 - fVar251) + fVar97 * fVar251;
      fVar97 = fVar280 + fVar97 * fVar228;
      fVar280 = 1.0 / fVar181;
      auVar114._0_4_ = fVar263 - fVar254;
      auVar114._4_4_ = fVar270 - fVar282;
      auVar114._8_4_ = fVar263 - fVar263;
      auVar114._12_4_ = fVar270 - fVar270;
      auVar138._0_8_ = CONCAT44(fVar252 - fVar239,fVar242 - fVar237);
      auVar138._8_4_ = fVar242 - fVar242;
      auVar138._12_4_ = fVar252 - fVar252;
      auVar169._0_4_ = fVar262 - fVar257;
      auVar169._4_4_ = fVar235 - fVar261;
      auVar169._8_4_ = fVar262 - fVar262;
      auVar169._12_4_ = fVar235 - fVar235;
      auVar224._0_8_ = CONCAT44((fVar261 - fVar241) * 3.0,(fVar257 - fVar234) * 3.0);
      auVar224._8_4_ = (fVar262 - fVar253) * 3.0;
      auVar224._12_4_ = (fVar235 - fVar255) * 3.0;
      auVar151._0_8_ = CONCAT44((fVar239 - fVar261) * 3.0,(fVar237 - fVar257) * 3.0);
      auVar151._8_4_ = (fVar242 - fVar262) * 3.0;
      auVar151._12_4_ = (fVar252 - fVar235) * 3.0;
      auVar247._0_4_ = (fVar254 - fVar237) * 3.0;
      auVar247._4_4_ = (fVar282 - fVar239) * 3.0;
      auVar247._8_4_ = (fVar263 - fVar242) * 3.0;
      auVar247._12_4_ = (fVar270 - fVar252) * 3.0;
      auVar201._8_4_ = auVar151._8_4_;
      auVar201._0_8_ = auVar151._0_8_;
      auVar201._12_4_ = auVar151._12_4_;
      auVar127 = minps(auVar201,auVar247);
      auVar163 = maxps(auVar151,auVar247);
      auVar230._8_4_ = auVar224._8_4_;
      auVar230._0_8_ = auVar224._0_8_;
      auVar230._12_4_ = auVar224._12_4_;
      auVar273 = minps(auVar230,auVar127);
      auVar220 = maxps(auVar224,auVar163);
      auVar15._4_8_ = auVar163._8_8_;
      auVar15._0_4_ = auVar273._4_4_;
      auVar152._0_8_ = auVar15._0_8_ << 0x20;
      auVar152._8_4_ = auVar273._8_4_;
      auVar152._12_4_ = auVar273._12_4_;
      auVar153._8_8_ = auVar273._8_8_;
      auVar153._0_8_ = auVar152._8_8_;
      auVar16._4_8_ = auVar127._8_8_;
      auVar16._0_4_ = auVar220._4_4_;
      auVar202._0_8_ = auVar16._0_8_ << 0x20;
      auVar202._8_4_ = auVar220._8_4_;
      auVar202._12_4_ = auVar220._12_4_;
      auVar203._8_8_ = auVar220._8_8_;
      auVar203._0_8_ = auVar202._8_8_;
      auVar127 = minps(auVar273,auVar153);
      auVar163 = maxps(auVar220,auVar203);
      fVar256 = auVar127._0_4_ * fVar280;
      fVar264 = auVar127._4_4_ * fVar280;
      fVar271 = auVar127._8_4_ * fVar280;
      fVar277 = auVar127._12_4_ * fVar280;
      fVar235 = fVar280 * auVar163._0_4_;
      fVar237 = fVar280 * auVar163._4_4_;
      fVar242 = fVar280 * auVar163._8_4_;
      fVar280 = fVar280 * auVar163._12_4_;
      fVar238 = 1.0 / (fVar97 - fVar96);
      auVar85._0_8_ = CONCAT44(fVar255 - fVar241,fVar253 - fVar234);
      auVar85._8_4_ = fVar253 - fVar253;
      auVar85._12_4_ = fVar255 - fVar255;
      auVar211._8_4_ = auVar85._8_4_;
      auVar211._0_8_ = auVar85._0_8_;
      auVar211._12_4_ = auVar85._12_4_;
      auVar220 = minps(auVar211,auVar169);
      auVar163 = maxps(auVar85,auVar169);
      auVar133._8_4_ = auVar138._8_4_;
      auVar133._0_8_ = auVar138._0_8_;
      auVar133._12_4_ = auVar138._12_4_;
      auVar127 = minps(auVar133,auVar114);
      auVar220 = minps(auVar220,auVar127);
      auVar127 = maxps(auVar138,auVar114);
      auVar163 = maxps(auVar163,auVar127);
      fVar282 = auVar220._0_4_ * fVar238;
      fVar285 = auVar220._4_4_ * fVar238;
      fVar240 = fVar238 * auVar163._0_4_;
      fVar238 = fVar238 * auVar163._4_4_;
      local_518._4_4_ = fVar96;
      local_518._0_4_ = fVar134;
      fStack_510 = fVar136;
      fStack_50c = fVar97;
      auVar204._4_4_ = fVar97;
      auVar204._0_4_ = fVar136;
      auVar204._8_4_ = fVar205;
      auVar204._12_4_ = fVar182;
      local_b8 = (fVar134 + fVar136) * 0.5;
      fVar262 = (fVar96 + fVar97) * 0.5;
      fVar263 = (fVar136 + fVar205) * 0.0;
      fVar270 = (fVar97 + fVar182) * 0.0;
      fVar228 = local_118 * local_b8 + fVar216;
      fVar234 = fStack_114 * local_b8 + fVar217;
      fVar241 = fStack_110 * local_b8 + fStack_4b0;
      fVar251 = fStack_10c * local_b8 + fStack_4ac;
      fStack_480 = auVar164._8_4_;
      fStack_47c = auVar164._12_4_;
      fVar253 = local_128 * local_b8 + fVar276;
      fVar255 = fStack_124 * local_b8 + fVar278;
      fVar257 = fStack_120 * local_b8 + fStack_480;
      fVar261 = fStack_11c * local_b8 + fStack_47c;
      fVar228 = (fVar253 - fVar228) * local_b8 + fVar228;
      fVar234 = (fVar255 - fVar234) * local_b8 + fVar234;
      fVar241 = (fVar257 - fVar241) * local_b8 + fVar241;
      fVar251 = (fVar261 - fVar251) * local_b8 + fVar251;
      fVar253 = (((local_138 * local_b8 + fVar140) - fVar253) * local_b8 + fVar253) - fVar228;
      fVar255 = (((fStack_134 * local_b8 + fVar141) - fVar255) * local_b8 + fVar255) - fVar234;
      fVar257 = (((fStack_130 * local_b8 + fVar156) - fVar257) * local_b8 + fVar257) - fVar241;
      fVar261 = (((fStack_12c * local_b8 + fVar176) - fVar261) * local_b8 + fVar261) - fVar251;
      fVar228 = local_b8 * fVar253 + fVar228;
      fVar234 = local_b8 * fVar255 + fVar234;
      fVar253 = fVar253 * 3.0;
      fVar255 = fVar255 * 3.0;
      fVar241 = (local_b8 * fVar257 + fVar241) - fVar228;
      fVar251 = (local_b8 * fVar261 + fVar251) - fVar234;
      fVar253 = (fVar257 * 3.0 - fVar253) * fVar262 + fVar253;
      fVar255 = (fVar261 * 3.0 - fVar255) * fVar262 + fVar255;
      auVar139._0_8_ = CONCAT44(fVar253,fVar241) ^ 0x80000000;
      auVar139._8_4_ = fVar253;
      auVar139._12_4_ = fVar253;
      fVar279 = fVar134 - local_b8;
      fVar281 = fVar96 - fVar262;
      fVar286 = fVar136 - fVar263;
      fVar287 = fVar97 - fVar270;
      fVar265 = fVar136 - local_b8;
      fVar269 = fVar97 - fVar262;
      fVar205 = fVar205 - fVar263;
      fVar182 = fVar182 - fVar270;
      fVar228 = fVar241 * fVar262 + fVar228;
      fVar234 = fVar251 * fVar262 + fVar234;
      auVar154._0_8_ = CONCAT44(fVar255,fVar251) ^ 0x8000000000000000;
      auVar154._8_4_ = -fVar255;
      auVar154._12_4_ = -fVar255;
      auVar86._0_4_ = fVar251 * fVar253 - fVar255 * fVar241;
      auVar86._4_4_ = auVar86._0_4_;
      auVar86._8_4_ = auVar86._0_4_;
      auVar86._12_4_ = auVar86._0_4_;
      auVar164 = divps(auVar154,auVar86);
      auVar163 = divps(auVar139,auVar86);
      fVar261 = auVar164._0_4_;
      fVar263 = auVar164._4_4_;
      fVar255 = auVar163._0_4_;
      fVar257 = auVar163._4_4_;
      local_b8 = local_b8 - (fVar234 * fVar255 + fVar228 * fVar261);
      local_a8 = fVar262 - (fVar234 * fVar257 + fVar228 * fVar263);
      fVar253 = fVar262 - (fVar234 * auVar163._8_4_ + fVar228 * auVar164._8_4_);
      fVar262 = fVar262 - (fVar234 * auVar163._12_4_ + fVar228 * auVar164._12_4_);
      auVar115._0_8_ = CONCAT44(fVar263 * fVar282,fVar263 * fVar256);
      auVar115._8_4_ = fVar263 * fVar264;
      auVar115._12_4_ = fVar263 * fVar285;
      auVar87._0_4_ = fVar263 * fVar235;
      auVar87._4_4_ = fVar263 * fVar240;
      auVar87._8_4_ = fVar263 * fVar237;
      auVar87._12_4_ = fVar263 * fVar238;
      auVar284._8_4_ = auVar115._8_4_;
      auVar284._0_8_ = auVar115._0_8_;
      auVar284._12_4_ = auVar115._12_4_;
      auVar220 = minps(auVar284,auVar87);
      auVar163 = maxps(auVar87,auVar115);
      auVar170._0_8_ = CONCAT44(fVar257 * fVar285,fVar257 * fVar264);
      auVar170._8_4_ = fVar257 * fVar271;
      auVar170._12_4_ = fVar257 * fVar277;
      auVar116._0_4_ = fVar257 * fVar237;
      auVar116._4_4_ = fVar257 * fVar238;
      auVar116._8_4_ = fVar257 * fVar242;
      auVar116._12_4_ = fVar257 * fVar280;
      auVar231._8_4_ = auVar170._8_4_;
      auVar231._0_8_ = auVar170._0_8_;
      auVar231._12_4_ = auVar170._12_4_;
      auVar127 = minps(auVar231,auVar116);
      auVar164 = maxps(auVar116,auVar170);
      fVar228 = 0.0 - (auVar164._0_4_ + auVar163._0_4_);
      fVar234 = 1.0 - (auVar164._4_4_ + auVar163._4_4_);
      fVar241 = 0.0 - (auVar164._8_4_ + auVar163._8_4_);
      fVar251 = 0.0 - (auVar164._12_4_ + auVar163._12_4_);
      fVar270 = 0.0 - (auVar127._0_4_ + auVar220._0_4_);
      fVar239 = 1.0 - (auVar127._4_4_ + auVar220._4_4_);
      fVar252 = 0.0 - (auVar127._8_4_ + auVar220._8_4_);
      fVar254 = 0.0 - (auVar127._12_4_ + auVar220._12_4_);
      auVar117._0_8_ = CONCAT44(fVar281 * fVar234,fVar279 * fVar228);
      auVar117._8_4_ = fVar286 * fVar241;
      auVar117._12_4_ = fVar287 * fVar251;
      auVar248._0_8_ = CONCAT44(fVar282 * fVar261,fVar256 * fVar261);
      auVar248._8_4_ = fVar264 * fVar261;
      auVar248._12_4_ = fVar285 * fVar261;
      auVar171._0_4_ = fVar261 * fVar235;
      auVar171._4_4_ = fVar261 * fVar240;
      auVar171._8_4_ = fVar261 * fVar237;
      auVar171._12_4_ = fVar261 * fVar238;
      auVar232._8_4_ = auVar248._8_4_;
      auVar232._0_8_ = auVar248._0_8_;
      auVar232._12_4_ = auVar248._12_4_;
      auVar164 = minps(auVar232,auVar171);
      auVar163 = maxps(auVar171,auVar248);
      auVar212._0_8_ = CONCAT44(fVar285 * fVar255,fVar264 * fVar255);
      auVar212._8_4_ = fVar271 * fVar255;
      auVar212._12_4_ = fVar277 * fVar255;
      auVar249._0_4_ = fVar255 * fVar237;
      auVar249._4_4_ = fVar255 * fVar238;
      auVar249._8_4_ = fVar255 * fVar242;
      auVar249._12_4_ = fVar255 * fVar280;
      auVar275._8_4_ = auVar212._8_4_;
      auVar275._0_8_ = auVar212._0_8_;
      auVar275._12_4_ = auVar212._12_4_;
      auVar220 = minps(auVar275,auVar249);
      auVar233._0_4_ = fVar279 * fVar270;
      auVar233._4_4_ = fVar281 * fVar239;
      auVar233._8_4_ = fVar286 * fVar252;
      auVar233._12_4_ = fVar287 * fVar254;
      auVar88._0_8_ = CONCAT44(fVar234 * fVar269,fVar228 * fVar265);
      auVar88._8_4_ = fVar241 * fVar205;
      auVar88._12_4_ = fVar251 * fVar182;
      auVar180._0_4_ = fVar270 * fVar265;
      auVar180._4_4_ = fVar239 * fVar269;
      auVar180._8_4_ = fVar252 * fVar205;
      auVar180._12_4_ = fVar254 * fVar182;
      auVar127 = maxps(auVar249,auVar212);
      fVar228 = 1.0 - (auVar127._0_4_ + auVar163._0_4_);
      fVar234 = 0.0 - (auVar127._4_4_ + auVar163._4_4_);
      fVar241 = 0.0 - (auVar127._8_4_ + auVar163._8_4_);
      fVar251 = 0.0 - (auVar127._12_4_ + auVar163._12_4_);
      fVar270 = 1.0 - (auVar220._0_4_ + auVar164._0_4_);
      fVar280 = 0.0 - (auVar220._4_4_ + auVar164._4_4_);
      fVar235 = 0.0 - (auVar220._8_4_ + auVar164._8_4_);
      fVar237 = 0.0 - (auVar220._12_4_ + auVar164._12_4_);
      auVar213._0_8_ = CONCAT44(fVar281 * fVar234,fVar279 * fVar228);
      auVar213._8_4_ = fVar286 * fVar241;
      auVar213._12_4_ = fVar287 * fVar251;
      auVar260._0_4_ = fVar279 * fVar270;
      auVar260._4_4_ = fVar281 * fVar280;
      auVar260._8_4_ = fVar286 * fVar235;
      auVar260._12_4_ = fVar287 * fVar237;
      auVar172._0_8_ = CONCAT44(fVar234 * fVar269,fVar228 * fVar265);
      auVar172._8_4_ = fVar241 * fVar205;
      auVar172._12_4_ = fVar251 * fVar182;
      auVar225._0_4_ = fVar270 * fVar265;
      auVar225._4_4_ = fVar280 * fVar269;
      auVar225._8_4_ = fVar235 * fVar205;
      auVar225._12_4_ = fVar237 * fVar182;
      auVar250._8_4_ = auVar213._8_4_;
      auVar250._0_8_ = auVar213._0_8_;
      auVar250._12_4_ = auVar213._12_4_;
      auVar163 = minps(auVar250,auVar260);
      auVar268._8_4_ = auVar172._8_4_;
      auVar268._0_8_ = auVar172._0_8_;
      auVar268._12_4_ = auVar172._12_4_;
      auVar164 = minps(auVar268,auVar225);
      auVar273 = minps(auVar163,auVar164);
      auVar164 = maxps(auVar260,auVar213);
      auVar163 = maxps(auVar225,auVar172);
      auVar127 = maxps(auVar163,auVar164);
      auVar214._8_4_ = auVar117._8_4_;
      auVar214._0_8_ = auVar117._0_8_;
      auVar214._12_4_ = auVar117._12_4_;
      auVar164 = minps(auVar214,auVar233);
      auVar173._8_4_ = auVar88._8_4_;
      auVar173._0_8_ = auVar88._0_8_;
      auVar173._12_4_ = auVar88._12_4_;
      auVar163 = minps(auVar173,auVar180);
      auVar164 = minps(auVar164,auVar163);
      auVar220 = maxps(auVar233,auVar117);
      auVar163 = maxps(auVar180,auVar88);
      auVar163 = maxps(auVar163,auVar220);
      auVar215._0_4_ = auVar273._4_4_ + auVar273._0_4_ + local_b8;
      auVar215._4_4_ = auVar164._4_4_ + auVar164._0_4_ + local_a8;
      auVar215._8_4_ = auVar273._8_4_ + auVar273._4_4_ + fVar253;
      auVar215._12_4_ = auVar273._12_4_ + auVar164._4_4_ + fVar262;
      fVar182 = auVar127._4_4_ + auVar127._0_4_ + local_b8;
      fVar205 = auVar163._4_4_ + auVar163._0_4_ + local_a8;
      auVar89._4_4_ = fVar205;
      auVar89._0_4_ = fVar182;
      auVar164 = maxps(_local_518,auVar215);
      auVar89._8_4_ = auVar127._8_4_ + auVar127._4_4_ + fVar253;
      auVar89._12_4_ = auVar127._12_4_ + auVar163._4_4_ + fVar262;
      auVar163 = minps(auVar89,auVar204);
      iVar37 = -(uint)(auVar163._0_4_ < auVar164._0_4_);
      iVar52 = -(uint)(auVar163._4_4_ < auVar164._4_4_);
      auVar91._4_4_ = iVar52;
      auVar91._0_4_ = iVar37;
      auVar91._8_4_ = iVar52;
      auVar91._12_4_ = iVar52;
      auVar90._8_8_ = auVar91._8_8_;
      auVar90._4_4_ = iVar37;
      auVar90._0_4_ = iVar37;
      uVar51 = movmskpd((uint)(fVar236 < 0.0),auVar90);
      uVar45 = (ulong)uVar51;
      if (uVar51 == 0) {
        uVar45 = 0;
        if ((fVar134 < auVar215._0_4_) && (fVar182 < fVar136)) {
          iVar37 = -(uint)(fVar205 < fVar97);
          uVar45 = (ulong)CONCAT11((char)((uint)iVar37 >> 8),(byte)iVar37 & fVar96 < auVar215._4_4_)
          ;
        }
        bVar36 = (3 < (uint)uVar47 || fVar181 < 0.001) | (byte)uVar45;
        pPVar38 = (Primitive *)(ulong)CONCAT31((int3)(uVar53 >> 8),bVar36);
        if (bVar36 != 1) goto LAB_00a9464a;
        lVar39 = 200;
        do {
          fVar97 = 1.0 - local_b8;
          fVar181 = local_b8 * local_b8 * local_b8;
          fVar136 = local_b8 * local_b8 * 3.0 * fVar97;
          fVar96 = fVar97 * fVar97 * fVar97;
          fVar182 = local_b8 * 3.0 * fVar97 * fVar97;
          fVar97 = fVar96 * fVar216 + fVar182 * fVar276 + fVar136 * fVar140 + fVar181 * fVar218;
          fVar134 = fVar96 * fVar217 + fVar182 * fVar278 + fVar136 * fVar141 + fVar181 * fVar226;
          fVar97 = ((fVar96 * fStack_4b0 +
                    fVar182 * fStack_480 + fVar136 * fVar156 + fVar181 * fVar57) - fVar97) *
                   local_a8 + fVar97;
          fVar134 = ((fVar96 * fStack_4ac +
                     fVar182 * fStack_47c + fVar136 * fVar176 + fVar181 * fVar56) - fVar134) *
                    local_a8 + fVar134;
          local_b8 = local_b8 - (fVar134 * fVar255 + fVar97 * fVar261);
          local_a8 = local_a8 - (fVar134 * fVar257 + fVar97 * fVar263);
          fVar96 = ABS(fVar134);
          if (ABS(fVar134) <= ABS(fVar97)) {
            fVar96 = ABS(fVar97);
          }
          if (fVar96 < local_328) {
            if ((((0.0 <= local_b8) && (local_b8 <= 1.0)) && (0.0 <= local_a8)) && (local_a8 <= 1.0)
               ) {
              fVar96 = (pLVar48->vx).field_0.m128[2];
              fVar97 = (pLVar48->vy).field_0.m128[2];
              fVar134 = (pLVar48->vz).field_0.m128[2];
              fVar234 = 1.0 - local_a8;
              fVar228 = 1.0 - local_b8;
              fVar136 = fVar228 * fVar228 * fVar228;
              fVar181 = local_b8 * 3.0 * fVar228 * fVar228;
              fVar205 = local_b8 * local_b8 * local_b8;
              fVar182 = local_b8 * local_b8 * 3.0 * fVar228;
              fVar96 = ((fStack_140 * fVar134 + fStack_144 * fVar97 + local_148 * fVar96) * fVar234
                       + (fStack_180 * fVar134 + fStack_184 * fVar97 + local_188 * fVar96) *
                         local_a8) * fVar136 +
                       ((fStack_150 * fVar134 + fStack_154 * fVar97 + local_158 * fVar96) * fVar234
                       + (fStack_190 * fVar134 + fStack_194 * fVar97 + local_198 * fVar96) *
                         local_a8) * fVar181 +
                       ((fStack_160 * fVar134 + fStack_164 * fVar97 + local_168 * fVar96) * fVar234
                       + (fStack_1a0 * fVar134 + fStack_1a4 * fVar97 + local_1a8 * fVar96) *
                         local_a8) * fVar182 +
                       (fVar234 * (fStack_170 * fVar134 + fStack_174 * fVar97 + local_178 * fVar96)
                       + (fVar134 * fStack_1b0 + fVar97 * fStack_1b4 + fVar96 * local_1b8) *
                         local_a8) * fVar205;
              if ((fVar95 <= fVar96) &&
                 (fVar97 = *(float *)(pRVar35 + k * 4 + 0x80), fVar96 <= fVar97)) {
                fVar241 = 1.0 - local_a8;
                fVar251 = 1.0 - local_a8;
                fVar253 = 1.0 - local_a8;
                fVar134 = local_398 * fVar241 + local_268 * local_a8;
                fVar234 = fStack_394 * fVar251 + fStack_264 * local_a8;
                fVar236 = fStack_390 * fVar253 + fStack_260 * local_a8;
                fVar255 = local_3b8 * fVar241 + fVar157 * local_a8;
                fVar261 = fStack_3b4 * fVar251 + fVar174 * local_a8;
                fVar263 = fStack_3b0 * fVar253 + fVar175 * local_a8;
                fVar257 = fVar255 - fVar134;
                fVar262 = fVar261 - fVar234;
                fVar270 = fVar263 - fVar236;
                fVar134 = (((fVar134 - (local_388 * fVar241 + local_378 * local_a8)) * fVar228 +
                           local_b8 * fVar257) * fVar228 +
                          (fVar257 * fVar228 +
                          ((fVar241 * local_3a8 + fVar98 * local_a8) - fVar255) * local_b8) *
                          local_b8) * 3.0;
                fVar234 = (((fVar234 - (fStack_384 * fVar251 + fStack_374 * local_a8)) * fVar228 +
                           local_b8 * fVar262) * fVar228 +
                          (fVar262 * fVar228 +
                          ((fVar251 * fStack_3a4 + fVar121 * local_a8) - fVar261) * local_b8) *
                          local_b8) * 3.0;
                fVar228 = (((fVar236 - (fStack_380 * fVar253 + fStack_370 * local_a8)) * fVar228 +
                           local_b8 * fVar270) * fVar228 +
                          (fVar270 * fVar228 +
                          ((fVar253 * fStack_3a0 + fVar123 * local_a8) - fVar263) * local_b8) *
                          local_b8) * 3.0;
                pGVar5 = (context->scene->geometries).items[uVar50].ptr;
                if ((pGVar5->mask & *(uint *)(pRVar35 + k * 4 + 0x90)) == 0) {
                  bVar49 = false;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar49 = true, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar236 = fVar136 * local_288 +
                            fVar181 * local_298 + fVar182 * local_2a8 + fVar205 * local_2b8;
                  fVar241 = fVar136 * fStack_284 +
                            fVar181 * fStack_294 + fVar182 * fStack_2a4 + fVar205 * fStack_2b4;
                  fVar136 = fVar136 * fStack_280 +
                            fVar181 * fStack_290 + fVar182 * fStack_2a0 + fVar205 * fStack_2b0;
                  local_c8 = fVar241 * fVar134 - fVar234 * fVar236;
                  local_e8 = fVar136 * fVar234 - fVar228 * fVar241;
                  local_d8 = fVar236 * fVar228 - fVar134 * fVar136;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  fStack_c4 = local_c8;
                  fStack_c0 = local_c8;
                  fStack_bc = local_c8;
                  fStack_b4 = local_b8;
                  fStack_b0 = local_b8;
                  fStack_ac = local_b8;
                  fStack_a4 = local_a8;
                  fStack_a0 = local_a8;
                  fStack_9c = local_a8;
                  local_98 = CONCAT44(uStack_2d4,local_2d8);
                  uStack_90 = CONCAT44(uStack_2cc,uStack_2d0);
                  local_88 = CONCAT44(uStack_2c4,local_2c8);
                  uStack_80 = CONCAT44(uStack_2bc,uStack_2c0);
                  local_78 = context->user->instID[0];
                  uStack_74 = local_78;
                  uStack_70 = local_78;
                  uStack_6c = local_78;
                  local_68 = context->user->instPrimID[0];
                  uStack_64 = local_68;
                  uStack_60 = local_68;
                  uStack_5c = local_68;
                  *(float *)(pRVar35 + k * 4 + 0x80) = fVar96;
                  local_3d8 = *local_3c8;
                  local_308.valid = (int *)local_3d8;
                  local_308.geometryUserPtr = pGVar5->userPtr;
                  local_308.context = context->user;
                  local_308.ray = (RTCRayN *)pRVar35;
                  local_308.hit = (RTCHitN *)&local_e8;
                  local_308.N = 4;
                  p_Var40 = pGVar5->occlusionFilterN;
                  if (p_Var40 != (RTCFilterFunctionN)0x0) {
                    p_Var40 = (RTCFilterFunctionN)(*p_Var40)(&local_308);
                  }
                  auVar118._0_4_ = -(uint)(local_3d8._0_4_ == 0);
                  auVar118._4_4_ = -(uint)(local_3d8._4_4_ == 0);
                  auVar118._8_4_ = -(uint)(local_3d8._8_4_ == 0);
                  auVar118._12_4_ = -(uint)(local_3d8._12_4_ == 0);
                  uVar51 = movmskps((int)p_Var40,auVar118);
                  pRVar41 = (RTCRayN *)(ulong)(uVar51 ^ 0xf);
                  if ((uVar51 ^ 0xf) == 0) {
                    auVar118 = auVar118 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var40 = context->args->filter;
                    if ((p_Var40 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var40)(&local_308);
                    }
                    auVar92._0_4_ = -(uint)(local_3d8._0_4_ == 0);
                    auVar92._4_4_ = -(uint)(local_3d8._4_4_ == 0);
                    auVar92._8_4_ = -(uint)(local_3d8._8_4_ == 0);
                    auVar92._12_4_ = -(uint)(local_3d8._12_4_ == 0);
                    auVar118 = auVar92 ^ _DAT_01f7ae20;
                    *(undefined1 (*) [16])(local_308.ray + 0x80) =
                         ~auVar92 & _DAT_01f7aa00 |
                         *(undefined1 (*) [16])(local_308.ray + 0x80) & auVar92;
                    pRVar41 = local_308.ray;
                  }
                  auVar119._0_4_ = auVar118._0_4_ << 0x1f;
                  auVar119._4_4_ = auVar118._4_4_ << 0x1f;
                  auVar119._8_4_ = auVar118._8_4_ << 0x1f;
                  auVar119._12_4_ = auVar118._12_4_ << 0x1f;
                  iVar37 = movmskps((int)pRVar41,auVar119);
                  bVar49 = iVar37 != 0;
                  if (!bVar49) {
                    *(float *)(pRVar35 + k * 4 + 0x80) = fVar97;
                  }
                }
                local_52c = (uint)(byte)(bVar42 | bVar49);
                uVar45 = (ulong)local_52c;
                pLVar48 = local_4a8;
              }
            }
            break;
          }
          lVar39 = lVar39 + -1;
        } while (lVar39 != 0);
      }
    }
  }
  goto LAB_00a94cbd;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }